

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O1

void lj_asm_trace(jit_State *J,GCtrace *T)

{
  MCode *pMVar1;
  IROp1 *pIVar2;
  char *pcVar3;
  char cVar4;
  uint8_t uVar5;
  undefined1 uVar6;
  ushort uVar7;
  short sVar8;
  ushort uVar9;
  CTypeID id;
  ExitNo exitno;
  SnapShot *pSVar10;
  GCtrace *T_00;
  byte bVar11;
  uint6 uVar12;
  undefined8 uVar13;
  MCode *pMVar14;
  byte bVar15;
  Reg RVar16;
  CTInfo CVar17;
  Reg RVar18;
  Reg rb;
  TRef TVar19;
  MSize MVar20;
  MCode *p;
  GCtrace *pGVar21;
  IRIns *pIVar22;
  uint *puVar23;
  SnapShot *pSVar24;
  SnapEntry *pSVar25;
  MCode MVar26;
  int iVar27;
  undefined4 uVar28;
  uint uVar29;
  long lVar30;
  ushort *puVar31;
  byte *pbVar32;
  SnapEntry *pSVar33;
  IRIns *pIVar34;
  code *pcVar35;
  int iVar36;
  x86Shift xs;
  IRRef IVar37;
  IRCallID id_00;
  MCode *p_1;
  RegSet RVar38;
  ulong uVar39;
  IRIns IVar40;
  uint uVar41;
  SnapEntry *pSVar42;
  CCallInfo *pCVar43;
  RegSet blocked;
  x86Op xVar44;
  IRIns *unaff_RBP;
  undefined7 uVar45;
  byte bVar46;
  IRRef1 IVar47;
  int iVar48;
  code *target;
  uint16_t *puVar49;
  long lVar50;
  MCode MVar51;
  MCode MVar52;
  uint uVar53;
  int32_t iVar54;
  SnapEntry sn;
  uint uVar55;
  SnapEntry SVar56;
  uint uVar57;
  ulong uVar58;
  bool bVar59;
  CTSize sz;
  IRRef args [64];
  ushort auStack_10372 [32537];
  code *pcStack_540;
  undefined8 local_530;
  int local_524;
  undefined8 local_520;
  IRIns *local_518;
  SnapEntry *local_510;
  IRIns local_508 [16];
  SnapEntry *local_488;
  SnapEntry *local_480;
  IRIns *local_478;
  jit_State *local_470;
  IRRef2 local_468;
  undefined2 local_464;
  undefined1 local_462;
  undefined8 local_460;
  undefined8 uStack_458;
  uint32_t local_450;
  int local_44c;
  uint local_448;
  uint local_444;
  uint local_440;
  uint local_43c;
  uint local_438;
  uint local_434;
  uint local_430;
  uint local_42c;
  uint local_428;
  undefined4 local_410;
  IRRef local_40c;
  IRRef local_408;
  IRRef local_404;
  undefined8 local_400;
  GCtrace *local_3f8;
  GCtrace *local_3f0;
  MCode *local_3e8;
  SnapEntry *local_3e0;
  SnapEntry *local_3d8;
  SnapEntry *local_3d0;
  SnapEntry *local_3c8;
  SnapEntry *pSStack_3c0;
  SnapEntry *local_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  ushort local_370 [252];
  IRIns *local_178;
  uint local_16c;
  ulong local_168;
  jit_State *local_160;
  GCtrace *local_158;
  IRIns local_150;
  uint32_t local_148;
  global_State *local_140;
  CCallInfo local_138 [16];
  
  uVar39 = (ulong)(T->nins - 1);
  cVar4 = *(char *)((long)T->ir + uVar39 * 8 + 5);
  if ((cVar4 == '\x14') || (cVar4 == '\f')) {
    while ((cVar4 = *(char *)((long)T->ir + uVar39 * 8 + -3), cVar4 == '\x14' || (cVar4 == '\f'))) {
      uVar39 = uVar39 - 1;
    }
    T->nins = (IRRef)uVar39;
  }
  uVar55 = (J->cur).nins;
  if (J->irtoplim <= uVar55) {
    pcStack_540 = (code *)0x148871;
    lj_ir_growtop(J);
  }
  (J->cur).nins = uVar55 + 1;
  (J->cur).ir[uVar55] = (IRIns)0xc0000000000;
  pcStack_540 = (code *)0x143b08;
  local_470 = J;
  local_438 = uVar55;
  local_3f8 = T;
  pGVar21 = lj_trace_alloc(J->L,T);
  J->curfinal = pGVar21;
  local_450 = J->flags;
  local_404 = J->loopref;
  local_3b8 = (SnapEntry *)0x0;
  local_44c = 0;
  if ((ulong)J->parent == 0) {
    local_3f0 = (GCtrace *)0x0;
  }
  else {
    local_3f0 = (GCtrace *)(ulong)J->trace[J->parent].gcptr32;
  }
  pcStack_540 = (code *)0x143b70;
  local_488 = (SnapEntry *)lj_mcode_reserve(J,&local_3e8);
  local_3d8 = local_488;
  local_3e0 = local_488;
  local_480 = (SnapEntry *)(local_3e8 + 0x40);
  uVar7 = local_3f8->nsnap;
  if (0x1ff < uVar7) {
    pcStack_540 = (code *)0x1488cd;
    lj_trace_err(local_470,LJ_TRERR_SNAPOV);
  }
  if (uVar7 != 0) {
    MVar26 = '\x01';
    uVar39 = 0;
    do {
      pMVar14 = local_3e8;
      if (local_470->exitstubgroup[uVar39] == (MCode *)0x0) {
        if (local_488 <= local_3e8 + 0x8d) goto LAB_0014869c;
        *local_3e8 = 'j';
        local_3e8[1] = (MCode)((int)uVar39 << 5);
        MVar51 = 'z';
        lVar30 = 0;
        MVar52 = MVar26;
        do {
          lVar50 = lVar30;
          local_3e8[lVar50 + 2] = 0xeb;
          local_3e8[lVar50 + 3] = MVar51;
          local_3e8[lVar50 + 4] = 'j';
          local_3e8[lVar50 + 5] = MVar52;
          MVar52 = MVar52 + '\x01';
          MVar51 = MVar51 + 0xfc;
          lVar30 = lVar50 + 4;
        } while ((int)(lVar50 + 4) != 0x7c);
        local_3e8[lVar50 + 6] = 'j';
        local_3e8[lVar50 + 7] = (MCode)(uVar39 >> 3);
        pMVar1 = local_3e8 + lVar50 + 8;
        pMVar1[0] = 199;
        pMVar1[1] = 'D';
        pMVar1[2] = '$';
        pMVar1[3] = '\x10';
        *(int *)(local_3e8 + lVar50 + 0xc) = (int)local_470 + 0xaa0;
        local_3e8[lVar50 + 0x10] = 0xe9;
        *(int *)(local_3e8 + lVar50 + 0x11) = 0x1421d2 - (int)local_3e8;
        local_470->mcbot = local_3e8 + lVar50 + 0x15;
        local_3e8 = local_3e8 + lVar50 + 0x15;
        local_480 = (SnapEntry *)(pMVar14 + lVar50 + 0x55);
        local_470->exitstubgroup[uVar39] = pMVar14;
      }
      uVar39 = uVar39 + 1;
      MVar26 = MVar26 + ' ';
    } while (uVar39 != uVar7 + 0x1f >> 5);
  }
  local_464 = local_464 & 0xff00;
  local_140 = (global_State *)(J[-1].penalty + 0x1b);
  local_158 = T;
  local_160 = J;
LAB_00143ce3:
  local_488 = local_3e0;
  local_478 = J->curfinal->ir;
  (J->cur).nins = local_438;
  local_440 = local_438;
  pSVar42 = local_3e0;
  if (local_3b8 != (SnapEntry *)0x0) {
    if (((ulong)local_3b8 & 0xf) != 0) {
      pSVar42 = (SnapEntry *)((long)local_3e0 + ~(ulong)(((uint)local_3b8 & 0xf) - 1));
      pcStack_540 = (code *)0x143d47;
      memset(pSVar42,0x90,(ulong)((uint)local_3b8 & 0xf));
    }
    local_3e0 = pSVar42;
    pSVar42 = (SnapEntry *)((long)pSVar42 + (ulong)(local_44c == 0) * 3);
  }
  if (local_404 == 0) {
    local_488 = pSVar42 + -3;
    local_3c8 = (SnapEntry *)0x0;
  }
  else {
    local_488 = (SnapEntry *)((long)pSVar42 + -5);
    local_3c8 = (SnapEntry *)((long)pSVar42 + -5);
  }
  local_3d0 = (SnapEntry *)0x0;
  pSStack_3c0 = (SnapEntry *)0x0;
  local_400 = 0;
  local_408 = local_404;
  local_40c = local_404;
  if ((local_450 >> 0x19 & 1) == 0) {
    local_40c = 0xffffffff;
  }
  uVar5 = local_3f8->sinktags;
  uVar45 = (undefined7)((ulong)unaff_RBP >> 8);
  unaff_RBP = (IRIns *)CONCAT71(uVar45,uVar5);
  local_440 = local_3f8->nins;
  uVar39 = (ulong)local_440;
  local_460 = 0xffffffef;
  uStack_458 = 0;
  local_380 = 0;
  uStack_378 = 0;
  local_390 = 0;
  uStack_388 = 0;
  local_3a0 = 0;
  uStack_398 = 0;
  local_3b0 = 0;
  uStack_3a8 = 0;
  lVar30 = 0;
  do {
    *(undefined4 *)((long)local_508 + lVar30 * 4) = 0xffff0000;
    lVar30 = lVar30 + 1;
  } while (lVar30 != 0x20);
  if ((ulong)local_3f8->nk < 0x8000) {
    lVar30 = (ulong)local_3f8->nk << 3;
    do {
      *(undefined2 *)((long)local_478 + lVar30 + 6) = 0xff;
      lVar50 = lVar30;
      if (((0x604208U >> (*(uint *)((long)local_478 + lVar30 + 4) & 0x1f) & 1) != 0) &&
         (*(char *)((long)local_478 + lVar30 + 5) != '\x1b')) {
        lVar50 = lVar30 + 8;
        *(int *)((long)local_478 + lVar30) = (int)lVar50 + (int)local_478;
      }
      lVar30 = lVar50 + 8;
    } while (lVar50 < 0x3fff8);
  }
  *(undefined2 *)((long)local_478 + 0x40006) = 0x82;
  local_430 = local_440;
  local_434 = local_440;
  local_42c = (uint)local_3f8->nsnap;
  local_410 = 0;
  local_43c = 0x8000;
  local_438 = local_440;
  pIVar34 = local_478 + 0x8001;
  if (local_3f0 != (GCtrace *)0x0) {
    pcStack_540 = (code *)0x143ef7;
    pIVar22 = lj_snap_regspmap(local_470,local_3f0,local_470->exitno,pIVar34);
    if (2000 < (long)pIVar22 - (long)pIVar34) {
LAB_00148876:
      pcStack_540 = (code *)0x148888;
      lj_trace_err(local_470,LJ_TRERR_NYICOAL);
    }
    local_43c = (uint)((ulong)((long)pIVar22 + (-8 - (long)local_478)) >> 3);
    if (pIVar34 < pIVar22) {
      puVar31 = local_370;
      do {
        uVar7 = (pIVar34->field_0).prev;
        *puVar31 = uVar7;
        puVar31 = puVar31 + 1;
        IVar47 = uVar7 | 0x80;
        if (0xff < uVar7) {
          IVar47 = 0xff;
        }
        (pIVar34->field_0).prev = IVar47;
        pIVar34 = pIVar34 + 1;
      } while (pIVar34 < pIVar22);
    }
  }
  local_448 = 2;
  pIVar22 = local_478 + uVar39;
  if (pIVar34 < pIVar22) {
    bVar59 = false;
    do {
      if (uVar5 != '\0') {
        if ((pIVar34->field_1).r != 0xfe) {
          if ((pIVar34->field_1).r != 0xfd) goto LAB_00143fb8;
          (pIVar34->field_1).r = 0xfe;
        }
        goto LAB_001441d9;
      }
LAB_00143fb8:
      switch((pIVar34->field_1).o) {
      case '\x11':
        bVar59 = true;
        goto switchD_00143fd0_caseD_41;
      default:
switchD_00143fd0_caseD_12:
        if ((((short)(pIVar34->field_0).op2 < 0) || (-1 < (short)(pIVar34->field_0).op1)) ||
           (IVar47 = *(IRRef1 *)((long)local_478 + (ulong)(pIVar34->field_0).op1 * 8 + 6),
           0xfc < (byte)IVar47)) goto switchD_00143fd0_caseD_41;
        (pIVar34->field_0).prev = IVar47;
        break;
      case '$':
      case '%':
      case '&':
        if ((local_450 & 0x40) == 0) goto switchD_00143fd0_caseD_27;
        goto switchD_00143fd0_caseD_41;
      case '\'':
      case '(':
switchD_00143fd0_caseD_27:
        uVar7 = (pIVar34->field_0).op2;
        if (((short)uVar7 < 0) && (0xfc < *(byte *)((long)local_478 + (ulong)uVar7 * 8 + 6))) {
          *(undefined1 *)((long)local_478 + (ulong)uVar7 * 8 + 6) = 0x81;
          if (!bVar59) goto LAB_001441cf;
          local_460 = local_460 | 0x200000000;
        }
        goto switchD_00143fd0_caseD_41;
      case ',':
      case '-':
switchD_00143fd0_caseD_2c:
        if (((pIVar34->field_1).t.irt & 0x1f) == 0xe) goto switchD_00143fd0_caseD_41;
        (pIVar34->field_0).prev = 0x80;
        if (!bVar59) goto LAB_00144129;
        local_460 = local_460 | 0xfc700000000;
        break;
      case '.':
        if (((pIVar34->field_1).t.irt & 0x1f) != 0xe) goto switchD_00143fd0_caseD_2c;
LAB_001440e3:
        if (bVar59) {
          local_460 = local_460 | 0xffff0fc700000000;
        }
        (pIVar34->field_0).prev = 0x90;
        break;
      case '4':
        if (2 < (pIVar34->field_0).op2) goto LAB_001440e3;
        if ((local_450 & 0x20) != 0) goto switchD_00143fd0_caseD_41;
        (pIVar34->field_0).prev = 0x90;
        if (!bVar59) goto LAB_00144129;
        local_460 = local_460 | 0xf000100000000;
        break;
      case ';':
      case 'M':
      case 'N':
      case 'O':
      case 'P':
      case 'Q':
      case 'R':
      case 'T':
      case 'U':
      case '[':
        (pIVar34->field_0).prev = 0x80;
        if (bVar59) {
          local_460 = CONCAT44(0xffff0fc7,(uint)local_460);
        }
        else {
LAB_00144129:
          bVar59 = false;
        }
        break;
      case 'A':
      case 'B':
      case 'C':
      case 'E':
      case 'G':
      case 'Z':
        goto switchD_00143fd0_caseD_41;
      case 'W':
      case '\\':
        if (bVar59) {
          local_460 = CONCAT44(0xffff0fc7,(uint)local_460);
        }
        else {
LAB_001441cf:
          bVar59 = false;
        }
        goto switchD_00143fd0_caseD_41;
      case 'Y':
        if ((1 < (byte)(((pIVar34->field_1).t.irt & 0x1f) - 0xd)) &&
           (1 < (ushort)(((pIVar34->field_0).op2 & 0x1f) - 0xd))) goto switchD_00143fd0_caseD_12;
switchD_00143fd0_caseD_41:
        (pIVar34->field_0).prev = 0xff;
        break;
      case ']':
      case '^':
      case '_':
      case '`':
        uVar7 = (pIVar34->field_0).op2;
        pcStack_540 = (code *)0x144014;
        RVar16 = asm_setup_call_slots
                           ((ASMState *)&local_508[0].field_0,pIVar34,lj_ir_callinfo + uVar7);
        (pIVar34->field_0).prev = (IRRef1)RVar16;
        if (bVar59) {
          local_460 = CONCAT44(local_460._4_4_ |
                               (uint)((*(byte *)((long)&lj_ir_callinfo[uVar7].flags + 1) & 4) >> 2)
                               * 0x10000 - 0xf039,(uint)local_460);
        }
        break;
      case 'a':
        pcStack_540 = (code *)0x144141;
        local_138[0].flags = asm_callx_flags((ASMState *)&local_508[0].field_0,pIVar34);
        pcStack_540 = (code *)0x14415b;
        RVar16 = asm_setup_call_slots((ASMState *)&local_508[0].field_0,pIVar34,local_138);
        (pIVar34->field_0).prev = (IRRef1)RVar16;
        if (bVar59) {
          local_460 = local_460 | 0xffff0fc700000000;
        }
      }
LAB_001441d9:
      pIVar34 = pIVar34 + 1;
    } while (pIVar34 < pIVar22);
  }
  local_444 = local_448;
  if ((local_448 & 1) == 0) {
    local_444 = 0;
  }
  else {
    local_448 = local_448 + 1;
  }
  if (local_404 == 0) {
    pIVar34 = (IRIns *)(ulong)(local_3f8->nsnap - 1);
    pSVar10 = local_3f8->snap;
    uVar39 = (ulong)pSVar10[(long)pIVar34].nent;
    if (uVar39 == 0) {
      unaff_RBP = (IRIns *)0x0;
      uVar55 = 0;
    }
    else {
      uVar6 = 0;
      do {
        uVar55 = local_3f8->snapmap[(ulong)pSVar10[(long)pIVar34].mapofs + (uVar39 - 1)] >> 0x18;
        if ((local_3f8->snapmap[(ulong)pSVar10[(long)pIVar34].mapofs + (uVar39 - 1)] >> 0x10 & 1) !=
            0) {
          uVar6 = 1;
          goto LAB_0014427b;
        }
        uVar39 = uVar39 - 1;
      } while (uVar39 != 0);
      uVar55 = 0;
LAB_0014427b:
      unaff_RBP = (IRIns *)CONCAT71(uVar45,uVar6);
    }
    pSVar10 = pSVar10 + (long)pIVar34;
    local_400 = CONCAT44(local_400._4_4_,(uint)pSVar10->topslot);
    if (local_488 < local_480) goto LAB_0014869c;
    pcStack_540 = (code *)0x1442c1;
    ra_allocref((ASMState *)&local_508[0].field_0,0x8000,4);
    if (local_3f8->link == 0) {
      puVar23 = (uint *)(ulong)local_3f8->snapmap[(uint)pSVar10->nent + pSVar10->mapofs];
      if (((char)*puVar23 == 'W') &&
         (uVar39 = (ulong)local_470->trace[*puVar23 >> 0x10].gcptr32,
         0xfffffffb < *(byte *)(uVar39 + 0x38) - 0x4d)) {
        puVar23 = (uint *)(uVar39 + 0x38);
      }
      if (((int)local_470 + 0xaa0U == 0) &&
         (((byte)*local_488 == 0xf || (((byte)*local_488 & 0xf0) != 0x70)))) {
        *(byte *)((long)local_488 + -1) = 0xf6;
        ((byte *)((long)local_488 + -3))[0] = 0x45;
        ((byte *)((long)local_488 + -3))[1] = 0x33;
        pbVar32 = (byte *)((long)local_488 + -3);
      }
      else {
        local_488[-1] = (int)local_470 + 0xaa0U;
        ((byte *)((long)local_488 + -6))[0] = 0x41;
        ((byte *)((long)local_488 + -6))[1] = 0xbe;
        pbVar32 = (byte *)((long)local_488 + -6);
      }
      if (((int)puVar23 == 0) && ((*pbVar32 == 0xf || ((*pbVar32 & 0xf0) != 0x70)))) {
        pbVar32[-2] = 0x33;
        pbVar32[-1] = 0xdb;
        pbVar32 = pbVar32 + -2;
      }
      else {
        *(int *)(pbVar32 + -4) = (int)puVar23;
        pbVar32[-5] = 0xbb;
        pbVar32 = pbVar32 + -5;
      }
      iVar27 = pSVar10->nslots - uVar55;
      uVar41 = *puVar23;
      uVar57 = (uVar41 & 0xff) - 0x3f;
      uVar57 = uVar57 >> 1 | (uint)((uVar57 & 1) != 0) << 0x1f;
      if (uVar57 - 1 < 2) {
        uVar57 = uVar41 >> 0x10 & 0xff;
        iVar27 = iVar27 + (~uVar41 >> 8 | 0xffffff00);
LAB_0014442f:
        iVar27 = iVar27 - uVar57;
      }
      else {
        if (uVar57 == 0) {
          uVar57 = uVar41 >> 8 & 0xff;
          goto LAB_0014442f;
        }
        if (uVar57 == 5) {
          uVar57 = (uVar41 >> 0x10) + (uVar41 >> 8 & 0xff);
          goto LAB_0014442f;
        }
        if ((uVar41 & 0xff) < 0x59) {
          iVar27 = 0;
        }
      }
      if ((iVar27 == 0) && ((*pbVar32 == 0xf || ((*pbVar32 & 0xf0) != 0x70)))) {
        pbVar32[-2] = 0x33;
        pbVar32[-1] = 0xc0;
        local_488 = (SnapEntry *)(pbVar32 + -2);
      }
      else {
        *(int *)(pbVar32 + -4) = iVar27;
        pbVar32[-5] = 0xb8;
        local_488 = (SnapEntry *)(pbVar32 + -5);
      }
LAB_0014444c:
    }
    else if (uVar55 != 0) {
      local_488[-1] = (int)local_470 - 0xb8;
      *(byte *)((long)local_488 + -5) = 0x25;
      ((byte *)((long)local_488 + -7))[0] = 0x89;
      ((byte *)((long)local_488 + -7))[1] = 0x14;
      local_488 = (SnapEntry *)((long)local_488 + -7);
      goto LAB_0014444c;
    }
    local_524 = (int)unaff_RBP;
    if (uVar55 != 0) {
      SVar56 = uVar55 * 8;
      if ((int)(char)(byte)SVar56 == SVar56) {
        *(byte *)((long)local_488 + -1) = (byte)SVar56;
        local_488 = (SnapEntry *)((long)local_488 + -1);
        uVar28 = 0x830000fe;
      }
      else {
        local_488[-1] = SVar56;
        local_488 = local_488 + -1;
        uVar28 = 0x810000fe;
      }
      *(byte *)((long)local_488 + -1) = 0xc2;
      *(undefined4 *)((long)local_488 + -5) = uVar28;
      local_488 = (SnapEntry *)((long)local_488 + -2);
    }
    if ((ulong)local_470->ktrace != 0) {
      local_478[local_470->ktrace].field_1.op12 = *(IRRef2 *)&local_470->curfinal;
      *(undefined1 *)((long)local_478 + (ulong)local_470->ktrace * 8 + 5) = 0x18;
    }
    pIVar22 = (IRIns *)(ulong)pSVar10->nent;
    local_518 = pIVar34;
    if (pIVar22 != (IRIns *)0x0) {
      pSVar42 = local_3f8->snapmap + pSVar10->mapofs;
      pSVar24 = (SnapShot *)&local_3f8->nsnapmap;
      if (pSVar10 + 1 !=
          (SnapShot *)((long)&local_3f8->snap->mapofs + (ulong)((uint)local_3f8->nsnap * 0xc))) {
        pSVar24 = pSVar10 + 1;
      }
      local_510 = local_3f8->snapmap + (pSVar24->mapofs - 1);
      unaff_RBP = (IRIns *)0x0;
      local_530 = pIVar22;
      local_520 = pSVar42;
      do {
        pIVar34 = local_478;
        uVar55 = pSVar42[(long)unaff_RBP];
        if ((uVar55 >> 0x12 & 1) == 0) {
          SVar56 = (uVar55 >> 0x18) * 8 - 8;
          uVar41 = uVar55 & 0xffff;
          uVar39 = (ulong)uVar41;
          bVar15 = *(byte *)((long)local_478 + uVar39 * 8 + 4) & 0x1f;
          if (bVar15 == 0xe) {
            bVar15 = *(byte *)((long)local_478 + uVar39 * 8 + 6);
            RVar16 = (Reg)bVar15;
            if ((char)bVar15 < '\0') {
              pcStack_540 = (code *)0x144589;
              RVar16 = ra_allocref((ASMState *)&local_508[0].field_0,uVar41,0xffff0000);
            }
            bVar15 = (byte)RVar16 & 0x1f;
            uStack_458 = CONCAT44(uStack_458._4_4_,
                                  (uint)uStack_458 & (-2 << bVar15 | 0xfffffffeU >> 0x20 - bVar15));
            pcStack_540 = (code *)0x1445b2;
            emit_rmro((ASMState *)&local_508[0].field_0,XO_MOVSDto,RVar16,2,SVar56);
            pIVar22 = local_530;
            pSVar42 = local_520;
          }
          else {
            if (uVar41 < 0x8000) {
              if (2 < bVar15) {
                pSVar33 = local_488 + -1;
                local_488[-1] = local_478[uVar39].field_1.op12;
                if (SVar56 == 0) {
                  bVar15 = 2;
                }
                else if (uVar55 < 0x11000000) {
                  *(byte *)((long)local_488 + -5) = (byte)SVar56;
                  pSVar33 = (SnapEntry *)((long)local_488 + -5);
                  bVar15 = 0x42;
                }
                else {
                  local_488[-2] = SVar56;
                  pSVar33 = local_488 + -2;
                  bVar15 = 0x82;
                }
                *(byte *)((long)pSVar33 + -1) = bVar15;
                *(byte *)((long)pSVar33 + -2) = 199;
                local_488 = (SnapEntry *)((long)pSVar33 + -2);
              }
            }
            else {
              bVar15 = *(byte *)((long)local_478 + uVar39 * 8 + 6);
              RVar16 = (Reg)bVar15;
              if ((char)bVar15 < '\0') {
                pcStack_540 = (code *)0x144621;
                RVar16 = ra_allocref((ASMState *)&local_508[0].field_0,uVar41,0xffeb);
              }
              bVar15 = (byte)RVar16 & 0x1f;
              uStack_458 = CONCAT44(uStack_458._4_4_,
                                    (uint)uStack_458 & (-2 << bVar15 | 0xfffffffeU >> 0x20 - bVar15)
                                   );
              pcStack_540 = (code *)0x144664;
              emit_rmro((ASMState *)&local_508[0].field_0,XO_MOVto,
                        -(uint)((0x604208U >> (*(uint *)((long)pIVar34 + uVar39 * 8 + 4) & 0x1f) & 1
                                ) != 0) & 0x80200 | RVar16,2,SVar56);
              pIVar22 = local_530;
              pSVar42 = local_520;
            }
            uVar41 = (uVar55 >> 0x18) * 8;
            if ((uVar55 & 0x30000) == 0) {
              bVar15 = *(byte *)((long)pIVar34 + uVar39 * 8 + 4) & 0x1f;
              if (bVar15 != 3) {
                local_488[-1] = (int)(char)~bVar15;
                if (uVar41 < 0x84) {
                  *(byte *)((long)local_488 + -5) = (byte)(uVar41 - 4);
                  local_488 = (SnapEntry *)((long)local_488 + -5);
                  bVar15 = 0x42;
                }
                else {
                  local_488[-2] = uVar41 - 4;
                  local_488 = local_488 + -2;
                  bVar15 = 0x82;
                }
                goto LAB_0014473d;
              }
            }
            else if (0xffffff < uVar55) {
              local_488[-1] = *local_510;
              if (uVar41 < 0x84) {
                *(byte *)((long)local_488 + -5) = (byte)(uVar41 - 4);
                local_488 = (SnapEntry *)((long)local_488 + -5);
                bVar15 = 0x42;
              }
              else {
                local_488[-2] = uVar41 - 4;
                local_488 = local_488 + -2;
                bVar15 = 0x82;
              }
              local_510 = local_510 + -1;
LAB_0014473d:
              *(byte *)((long)local_488 + -1) = bVar15;
              *(byte *)((long)local_488 + -2) = 199;
              local_488 = (SnapEntry *)((long)local_488 + -2);
            }
          }
          if (local_488 < local_480) goto LAB_0014869c;
        }
        unaff_RBP = (IRIns *)((long)unaff_RBP + 1);
      } while (pIVar22 != unaff_RBP);
    }
    if ((local_3f0 == (GCtrace *)0x0 & (byte)local_524) == 1) {
      pcStack_540 = (code *)0x1447ac;
      asm_stack_check((ASMState *)&local_508[0].field_0,(BCReg)local_400,(IRIns *)0x0,
                      (uint)local_460 & 0xffef,(ExitNo)local_518);
    }
  }
switchD_00144850_caseD_c:
  do {
    local_440 = local_440 - 1;
    if (local_440 <= local_43c) goto LAB_00147b52;
    unaff_RBP = local_478 + local_440;
    pcStack_540 = (code *)0x1447e1;
    asm_snap_prev((ASMState *)&local_508[0].field_0);
  } while (((((char)(unaff_RBP->field_1).r < '\0') && ((unaff_RBP->field_1).s == '\0')) &&
           ((((unaff_RBP->field_1).t.irt | 0x60) & lj_ir_mode[(unaff_RBP->field_1).o]) < 0x60)) &&
          ((local_450 & 0x40000) != 0));
  if ((char)(unaff_RBP->field_1).t.irt < '\0') {
    pcStack_540 = (code *)0x14481e;
    asm_snap_prep((ASMState *)&local_508[0].field_0);
  }
  pIVar34 = local_478;
  if (local_488 < local_480) goto LAB_0014869c;
  switch((unaff_RBP->field_1).o) {
  case '\0':
  case '\x01':
  case '\x02':
  case '\x03':
  case '\x04':
  case '\x05':
  case '\x06':
  case '\a':
  case '\n':
    goto switchD_00144850_caseD_0;
  case '\b':
  case '\t':
    if ((*(char *)((long)unaff_RBP + -3) == ':') &&
       (local_440 - 1 == (uint)(unaff_RBP->field_0).op1)) {
      pIVar2 = &(unaff_RBP->field_1).o;
      unaff_RBP = unaff_RBP + -1;
      pcStack_540 = (code *)0x144ae7;
      local_440 = local_440 - 1;
      asm_href((ASMState *)&local_508[0].field_0,unaff_RBP,(uint)*pIVar2);
    }
    else {
switchD_00144850_caseD_0:
      pcStack_540 = (code *)0x14485f;
      asm_comp((ASMState *)&local_508[0].field_0,unaff_RBP);
    }
    goto switchD_00144850_caseD_c;
  case '\v':
    RVar16 = (Reg)*(byte *)((long)local_478 + 0x40006);
    if ((char)*(byte *)((long)local_478 + 0x40006) < '\0') {
      pcStack_540 = (code *)0x1456c8;
      RVar16 = ra_allocref((ASMState *)&local_508[0].field_0,0x8000,0xffef);
    }
    bVar15 = (byte)RVar16 & 0x1f;
    uStack_458 = CONCAT44(uStack_458._4_4_,
                          (uint)uStack_458 & (-2 << bVar15 | 0xfffffffeU >> 0x20 - bVar15));
    uVar55 = local_478[(unaff_RBP->field_0).op2].field_1.op12;
    iVar48 = *(byte *)((ulong)uVar55 - 3) + 1;
    iVar36 = (BCReg)local_400 - iVar48;
    iVar27 = 0;
    if (0 < iVar36) {
      iVar27 = iVar36;
    }
    local_400 = CONCAT44(local_400._4_4_,iVar27);
    *(byte *)((long)local_478 + 0x40004) = *(byte *)((long)local_478 + 0x40004) | 0x20;
    local_488[-1] = (int)local_470 - 0xb8;
    *(byte *)((long)local_488 + -5) = 0x25;
    *(byte *)((long)local_488 + -6) = (byte)RVar16 * '\b' & 0x38 | 4;
    *(byte *)((long)local_488 + -7) = 0x89;
    if ((RVar16 & 8) == 0) {
      local_488 = (SnapEntry *)((long)local_488 + -7);
    }
    else {
      *(byte *)(local_488 + -2) = 0x44;
      local_488 = local_488 + -2;
    }
    pcStack_540 = (code *)0x146295;
    emit_gri((ASMState *)&local_508[0].field_0,0x838100,RVar16,iVar48 * -8);
    pcStack_540 = (code *)0x1462a2;
    asm_guardcc((ASMState *)&local_508[0].field_0,5);
    if ((int)(char)(byte)uVar55 == uVar55) {
      *(byte *)((long)local_488 + -1) = (byte)uVar55;
      xVar44 = XO_ARITHi8;
      local_488 = (SnapEntry *)((long)local_488 + -1);
    }
    else {
      local_488[-1] = uVar55;
      local_488 = local_488 + -1;
      xVar44 = XO_ARITHi;
    }
    RVar18 = 7;
    goto LAB_00146845;
  case '\f':
  case '\x10':
  case 'X':
  case 'b':
    goto switchD_00144850_caseD_c;
  default:
    (local_470->errinfo).n = (double)(unaff_RBP->field_1).o;
    pcStack_540 = (code *)0x1488bb;
    lj_trace_err_info(local_470,LJ_TRERR_NYIIR);
  case '\x0f':
    uVar13 = local_400;
    iVar27 = local_400._4_4_;
    for (pIVar34 = local_478 + (local_43c + 1); local_400 = uVar13, pIVar34 < unaff_RBP;
        pIVar34 = pIVar34 + 1) {
      if (((byte)((pIVar34->field_1).o + 0xb1) < 4) &&
         ((-1 < (char)(pIVar34->field_1).r || ((pIVar34->field_1).s != '\0')))) {
        iVar27 = iVar27 + 1;
        local_400._0_4_ = (BCReg)uVar13;
        local_400 = CONCAT44(iVar27,(BCReg)local_400);
      }
      uVar13 = local_400;
    }
    local_400._4_4_ = (int)((ulong)uVar13 >> 0x20);
    bVar59 = local_400._4_4_ != 0;
    if (bVar59) {
      pcStack_540 = (code *)0x1457ae;
      asm_gc_check((ASMState *)&local_508[0].field_0);
    }
    local_400 = CONCAT44(0x80000000,(BCReg)local_400);
    goto switchD_00144850_caseD_c;
  case '\x11':
    local_428 = local_42c;
    if (local_400._4_4_ != 0) {
      pcStack_540 = (code *)0x14553c;
      asm_gc_check((ASMState *)&local_508[0].field_0);
    }
    local_408 = 0;
    local_3c8 = (SnapEntry *)0x0;
    pSStack_3c0 = (SnapEntry *)0x0;
    if (local_40c != 0xffffffff) {
      local_40c = 0;
    }
    while( true ) {
      if (uStack_458._4_4_ == 0) {
        RVar38 = 0;
        blocked = 0;
      }
      else {
        blocked = 0;
        RVar38 = 0;
        uVar55 = uStack_458._4_4_;
        do {
          uVar41 = 0;
          if (uVar55 != 0) {
            for (; (uVar55 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
            }
          }
          bVar15 = *(byte *)((long)local_478 +
                            (ulong)*(ushort *)((long)&local_3b0 + (ulong)uVar41 * 2) * 8 + 6);
          uVar57 = (uint)bVar15;
          if (uVar41 != bVar15) {
            if (((uint)local_460 >> (uVar41 & 0x1f) & 1) == 0) {
              uVar7 = *(ushort *)((long)local_508 + (ulong)uVar41 * 4);
              if ((*(byte *)((long)local_478 + (ulong)uVar7 * 8 + 4) & 0x20) == 0) {
                pcStack_540 = (code *)0x1455d5;
                ra_restore((ASMState *)&local_508[0].field_0,(uint)uVar7);
                if (local_488 < local_480) goto LAB_0014869c;
              }
              else {
                blocked = blocked | 1 << ((byte)uVar41 & 0x1f);
                uVar57 = 0;
                if (-1 < (char)bVar15) {
                  uVar57 = 1 << (bVar15 & 0x1f);
                }
                RVar38 = RVar38 | uVar57;
                uVar57 = 0x80;
              }
            }
            if (uVar57 < 0x80) {
              pcStack_540 = (code *)0x14561f;
              ra_rename((ASMState *)&local_508[0].field_0,uVar57,uVar41);
              if (local_488 < local_480) goto LAB_0014869c;
            }
          }
          bVar15 = (byte)uVar41 & 0x1f;
          uVar55 = uVar55 & (-2 << bVar15 | 0xfffffffeU >> 0x20 - bVar15);
        } while (uVar55 != 0);
      }
      if (blocked == 0) break;
      if (((uint)local_460 & blocked) == 0) {
        pcStack_540 = (code *)0x145677;
        asm_phi_break((ASMState *)&local_508[0].field_0,blocked,RVar38,0xffef);
        pcStack_540 = (code *)0x145688;
        asm_phi_break((ASMState *)&local_508[0].field_0,blocked,RVar38,0xffff0000);
        if (local_488 < local_480) goto LAB_0014869c;
      }
    }
    uVar55 = ~(uStack_458._4_4_ | (uint)local_460) & local_460._4_4_ & 0xffff0000;
    while (uVar55 != 0) {
      uVar41 = 0;
      if (uVar55 != 0) {
        for (; (uVar55 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
        }
      }
      pcStack_540 = (code *)0x145d9e;
      ra_restore((ASMState *)&local_508[0].field_0,
                 (uint)*(ushort *)((long)local_508 + (ulong)uVar41 * 4));
      uVar55 = uVar55 & ~(1 << (uVar41 & 0x1f));
      if (local_488 < local_480) goto LAB_0014869c;
    }
    uVar55 = ~(uStack_458._4_4_ | (uint)local_460) & local_460._4_4_;
    while (uVar55 != 0) {
      uVar41 = 0;
      if (uVar55 != 0) {
        for (; (uVar55 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
        }
      }
      pcStack_540 = (code *)0x145de9;
      ra_restore((ASMState *)&local_508[0].field_0,
                 (uint)*(ushort *)((long)local_508 + (ulong)uVar41 * 4));
      uVar55 = uVar55 & ~(1 << (uVar41 & 0x1f));
      if (local_488 < local_480) goto LAB_0014869c;
    }
    pSVar42 = local_488;
    for (uVar55 = uStack_458._4_4_; local_488 = pSVar42, uVar55 != 0;
        uVar55 = uVar55 & (-2 << bVar15 | 0xfffffffeU >> 0x20 - bVar15)) {
      uVar57 = uVar55 >> 0x18 | (uVar55 & 0xff0000) >> 8 | (uVar55 & 0xff00) << 8 | uVar55 << 0x18;
      uVar41 = 0x1f;
      if (uVar57 != 0) {
        for (; uVar57 >> uVar41 == 0; uVar41 = uVar41 - 1) {
        }
      }
      uVar41 = uVar41 ^ 0x18;
      uVar7 = *(ushort *)((long)&local_3b0 + (ulong)uVar41 * 2);
      uVar39 = (ulong)uVar7;
      if (*(char *)((long)local_478 + uVar39 * 8 + 7) != '\0') {
        pIVar34 = local_478 + uVar39;
        (pIVar34->field_1).t.irt = (pIVar34->field_1).t.irt & 0xdf;
        bVar15 = *(byte *)((long)local_478 + uVar39 * 8 + 6);
        if ((char)bVar15 < '\0') {
          pcStack_540 = (code *)0x145e5f;
          RVar16 = ra_allocref((ASMState *)&local_508[0].field_0,(uint)uVar7,
                               1 << ((byte)uVar41 & 0x1f));
          bVar15 = (byte)RVar16;
        }
        uStack_458 = CONCAT44(uStack_458._4_4_,
                              (uint)uStack_458 &
                              (-2 << (bVar15 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar15 & 0x1f)));
        pcStack_540 = (code *)0x145e8f;
        emit_storeofs((ASMState *)&local_508[0].field_0,pIVar34,uVar41,4,
                      (uint)(pIVar34->field_1).s << 2);
        if (local_488 < local_480) goto LAB_0014869c;
      }
      bVar15 = (byte)uVar41 & 0x1f;
      pSVar42 = local_488;
    }
    unaff_RBP = (IRIns *)0x0;
    if (*(char *)((long)local_478 + (ulong)(local_438 - 1) * 8 + 5) == '\x13') {
      pIVar34 = local_478 + (local_438 - 1);
      unaff_RBP = (IRIns *)0x0;
      do {
        if (((pIVar34->field_1).s != '\0') &&
           (*(char *)((long)local_478 + (ulong)(pIVar34->field_0).op1 * 8 + 7) != '\0')) {
          unaff_RBP = (IRIns *)(ulong)((uint)unaff_RBP |
                                      ((byte)(((pIVar34->field_1).t.irt & 0x1f) - 0xd) < 2) + 1);
        }
        pcVar3 = (char *)((long)pIVar34 + -3);
        pIVar34 = pIVar34 + -1;
      } while (*pcVar3 == '\x13');
    }
    if (((ulong)unaff_RBP & 1) != 0) {
      if ((local_460 & 0xffef) == 0) {
        uVar39 = 0;
        uVar55 = -(uint)((0x604208U >>
                          (*(uint *)((long)local_478 + (ulong)(ushort)local_508[0]._0_2_ * 8 + 4) &
                          0x1f) & 1) != 0) & 0x80200;
        *(byte *)((long)pSVar42 + -1) = 0x24;
        ((byte *)((long)pSVar42 + -3))[0] = 0x8b;
        ((byte *)((long)pSVar42 + -3))[1] = 4;
        if ((short)uVar55 == 0) {
          local_488 = (SnapEntry *)((long)pSVar42 + -3);
        }
        else {
          local_488 = pSVar42 + -1;
          *(byte *)(pSVar42 + -1) = (byte)(uVar55 >> 0x10) | 0x40;
        }
      }
      else {
        uVar55 = 0;
        if ((local_460 & 0xffef) != 0) {
          for (; (((uint)local_460 & 0xffef) >> uVar55 & 1) == 0; uVar55 = uVar55 + 1) {
          }
        }
        uVar39 = (ulong)uVar55;
      }
      uVar55 = (uint)uVar39;
      if (*(char *)((long)local_478 + (ulong)(local_438 - 1) * 8 + 5) == '\x13') {
        pIVar34 = local_478 + (local_438 - 1);
        do {
          if ((pIVar34->field_1).s != '\0') {
            bVar15 = *(byte *)((long)local_478 + (ulong)(pIVar34->field_0).op1 * 8 + 7);
            if ((bVar15 != 0) && (1 < (byte)(((pIVar34->field_1).t.irt & 0x1f) - 0xd))) {
              pcStack_540 = (code *)0x147301;
              emit_storeofs((ASMState *)&local_508[0].field_0,local_478 + (pIVar34->field_0).op1,
                            uVar55,4,(uint)bVar15 << 2);
              pcStack_540 = (code *)0x14731c;
              emit_loadofs((ASMState *)&local_508[0].field_0,pIVar34,uVar55,4,
                           (uint)(pIVar34->field_1).s << 2);
              if (local_488 < local_480) goto LAB_0014869c;
            }
          }
          pcVar3 = (char *)((long)pIVar34 + -3);
          pIVar34 = pIVar34 + -1;
        } while (*pcVar3 == '\x13');
      }
      if (((uint)local_460 >> (uVar55 & 0x1f) & 1) == 0) {
        pcStack_540 = (code *)0x147370;
        emit_storeofs((ASMState *)&local_508[0].field_0,
                      local_478 + *(ushort *)((long)local_508 + uVar39 * 4),uVar55,4,0);
      }
    }
    if (((ulong)unaff_RBP & 2) != 0) {
      uVar55 = 0;
      bVar59 = (local_460 & 0xffff0000) != 0;
      if (bVar59) {
        for (; (((uint)local_460 & 0xffff0000) >> uVar55 & 1) == 0; uVar55 = uVar55 + 1) {
        }
      }
      uVar39 = 0x10;
      if (bVar59) {
        uVar39 = (ulong)uVar55;
      }
      uVar55 = (uint)uVar39;
      uVar41 = 1 << ((byte)uVar39 & 0x1f);
      unaff_RBP = (IRIns *)(ulong)uVar41;
      if (((uint)local_460 >> (uVar55 & 0x1f) & 1) == 0) {
        pcStack_540 = (code *)0x1473c7;
        emit_loadofs((ASMState *)&local_508[0].field_0,
                     local_478 + *(ushort *)((long)local_508 + uVar39 * 4),uVar55,4,0);
      }
      if (*(char *)((long)local_478 + (ulong)(local_438 - 1) * 8 + 5) == '\x13') {
        pIVar34 = local_478 + (local_438 - 1);
        do {
          if ((pIVar34->field_1).s != '\0') {
            bVar15 = *(byte *)((long)local_478 + (ulong)(pIVar34->field_0).op1 * 8 + 7);
            if ((bVar15 != 0) && ((byte)(((pIVar34->field_1).t.irt & 0x1f) - 0xd) < 2)) {
              pcStack_540 = (code *)0x147430;
              emit_storeofs((ASMState *)&local_508[0].field_0,local_478 + (pIVar34->field_0).op1,
                            uVar55,4,(uint)bVar15 << 2);
              pcStack_540 = (code *)0x14744b;
              emit_loadofs((ASMState *)&local_508[0].field_0,pIVar34,uVar55,4,
                           (uint)(pIVar34->field_1).s << 2);
              if (local_488 < local_480) goto LAB_0014869c;
            }
          }
          pcVar3 = (char *)((long)pIVar34 + -3);
          pIVar34 = pIVar34 + -1;
        } while (*pcVar3 == '\x13');
      }
      if (((uint)local_460 & uVar41) == 0) {
        pcStack_540 = (code *)0x14749c;
        emit_storeofs((ASMState *)&local_508[0].field_0,
                      local_478 + *(ushort *)((long)local_508 + uVar39 * 4),uVar55,4,0);
      }
    }
    iVar27 = (int)local_488;
    if (local_3b8 == (SnapEntry *)0x0) {
      *(byte *)((long)local_3e0 + -5) = 0xe9;
      if (local_44c == 0) {
        iVar48 = iVar27 - (int)local_3e0;
        lVar30 = 3;
        lVar50 = -4;
        pSVar33 = local_3e0;
LAB_00147544:
        *(int *)((long)local_3e0 + lVar50) = iVar48;
        pSVar25 = (SnapEntry *)((long)local_488 + lVar30);
      }
      else {
        pSVar33 = (SnapEntry *)((long)local_3e0 + -5);
        iVar48 = iVar27 - (int)pSVar33;
        *(int *)((long)local_3e0 + -9) = iVar48;
        if (local_44c == 2) {
          iVar48 = iVar48 + 6;
          lVar30 = 8;
          lVar50 = -0xf;
          goto LAB_00147544;
        }
        pSVar25 = local_488 + 1;
      }
      if (pSVar33 + -0x20 <= pSVar25) {
        local_3b8 = pSVar25;
        local_440 = local_43c;
        local_3f8->nins = local_438;
      }
    }
    else {
      local_3b8 = (SnapEntry *)0x0;
      if (local_44c == 0) {
        *(char *)((long)local_3e0 + -1) = (char)local_488 - (char)local_3e0;
        *(byte *)((long)local_3e0 + -2) = 0xeb;
      }
      else {
        *(byte *)((long)local_3e0 + -5) = 0xe9;
        bVar15 = (char)local_488 - ((char)local_3e0 + -5);
        *(byte *)((long)local_3e0 + -6) = bVar15;
        if (local_44c == 2) {
          *(byte *)(local_3e0 + -2) = bVar15 + 2;
        }
      }
    }
    local_3d0 = local_488;
    if (local_488 != pSVar42) {
      local_488[-1] = (int)pSVar42 - iVar27;
      *(byte *)((long)local_488 + -5) = 0xe9;
      local_488 = (SnapEntry *)((long)local_488 + -5);
      goto LAB_001475aa;
    }
    goto switchD_00144850_caseD_c;
  case '\x12':
    bVar15 = *(byte *)((long)local_478 + (ulong)(unaff_RBP->field_0).op1 * 8 + 6);
    if ((char)bVar15 < '\0') {
      RVar38 = 0xffef;
      if ((byte)(((unaff_RBP->field_1).t.irt & 0x1f) - 0xd) < 2) {
        RVar38 = 0xffff0000;
      }
      pcStack_540 = (code *)0x1454bb;
      RVar16 = ra_allocref((ASMState *)&local_508[0].field_0,(uint)(unaff_RBP->field_0).op1,RVar38);
      bVar15 = (byte)RVar16;
    }
    uStack_458 = CONCAT44(uStack_458._4_4_,
                          (uint)uStack_458 &
                          (-2 << (bVar15 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar15 & 0x1f)));
    goto switchD_00144850_caseD_c;
  case '\x13':
    uVar55 = 0xffef;
    if ((byte)(((unaff_RBP->field_1).t.irt & 0x1f) - 0xd) < 2) {
      uVar55 = 0xffff0000;
    }
    if ((unaff_RBP->field_1).r != 0xfe) {
      uVar39 = (ulong)(unaff_RBP->field_0).op1;
      if (*(char *)((long)local_478 + uVar39 * 8 + 7) == '\0') {
        pIVar22 = local_478 + (unaff_RBP->field_0).op2;
        if ((pIVar22->field_1).s == '\0') {
          uVar55 = uVar55 & ~uStack_458._4_4_;
          if (((uint)local_460 & uVar55 & ((uint)local_460 & uVar55) - 1) != 0) {
            if ((char)(pIVar22->field_1).r < '\0') {
              pcStack_540 = (code *)0x1470fd;
              uVar55 = ra_allocref((ASMState *)&local_508[0].field_0,(uint)(unaff_RBP->field_0).op2,
                                   uVar55);
            }
            else {
              pcStack_540 = (code *)0x146bdc;
              uVar55 = ra_scratch((ASMState *)&local_508[0].field_0,uVar55);
              pcStack_540 = (code *)0x146bf0;
              emit_movrr((ASMState *)&local_508[0].field_0,pIVar22,uVar55,(uint)(pIVar22->field_1).r
                        );
            }
            bVar15 = (byte)uVar55;
            (unaff_RBP->field_1).r = bVar15;
            uStack_458 = CONCAT44(uStack_458._4_4_ | 1 << (bVar15 & 0x1f),(uint)uStack_458);
            *(IRRef1 *)((long)&local_3b0 + (ulong)uVar55 * 2) = (unaff_RBP->field_0).op1;
            pbVar32 = (byte *)((long)pIVar34 + uVar39 * 8 + 4);
            *pbVar32 = *pbVar32 | 0x20;
            if (*(char *)((long)pIVar34 + uVar39 * 8 + 6) < '\0') {
              *(byte *)((long)pIVar34 + uVar39 * 8 + 6) = bVar15 | 0x80;
            }
            goto switchD_00144850_caseD_c;
          }
          if ((*(char *)((long)local_478 + uVar39 * 8 + 6) < '\0') &&
             ((char)(pIVar22->field_1).r < '\0')) {
            pcStack_540 = (code *)0x14540e;
            ra_spill((ASMState *)&local_508[0].field_0,unaff_RBP);
            (pIVar22->field_1).s = (unaff_RBP->field_1).s;
            goto switchD_00144850_caseD_c;
          }
        }
      }
      pcStack_540 = (code *)0x14889a;
      lj_trace_err(local_470,LJ_TRERR_NYIPHI);
    }
    goto switchD_00144850_caseD_c;
  case '\x15':
    pcStack_540 = (code *)0x14528e;
    asm_guardcc((ASMState *)&local_508[0].field_0,5);
    *(byte *)((long)local_488 + -1) = 0x80;
    *(int *)((long)local_488 + -5) = (int)local_470 + -0x13f;
    *(byte *)((long)local_488 + -6) = 0x25;
    *(undefined2 *)(local_488 + -2) = 0x4f6;
    local_488 = local_488 + -2;
    goto switchD_00144850_caseD_c;
  case '\x1f':
    pcStack_540 = (code *)0x145ad2;
    asm_neg_not((ASMState *)&local_508[0].field_0,unaff_RBP,XOg_NOT);
    goto switchD_00144850_caseD_c;
  case ' ':
    pcStack_540 = (code *)0x14542e;
    RVar16 = ra_dest((ASMState *)&local_508[0].field_0,unaff_RBP,0xffef);
    uVar41._0_2_ = *(IROpT *)((long)unaff_RBP + 4);
    uVar41._2_2_ = *(IRRef1 *)((long)unaff_RBP + 6);
    uVar55 = -(uint)((0x604208U >> (uVar41 & 0x1f) & 1) != 0) & 0x80200;
    local_488[-1] = (RVar16 & 7) << 0x18 | 0xc80f00fd;
    uVar41 = RVar16 >> 3 & 1;
    if ((uVar55 >> 1 & 0xffff) == 0 && uVar41 == 0) {
      local_488 = (SnapEntry *)((long)local_488 + -2);
    }
    else {
      *(byte *)((long)local_488 + -3) = (byte)(uVar55 >> 0x10) | (byte)uVar41 | 0x40;
      local_488 = (SnapEntry *)((long)local_488 + -3);
    }
    pcStack_540 = (code *)0x1467d0;
    ra_left((ASMState *)&local_508[0].field_0,RVar16,(uint)(unaff_RBP->field_0).op1);
    goto switchD_00144850_caseD_c;
  case '!':
    pcStack_540 = (code *)0x145a04;
    asm_intarith((ASMState *)&local_508[0].field_0,unaff_RBP,XOg_AND);
    goto switchD_00144850_caseD_c;
  case '\"':
    pcStack_540 = (code *)0x14587e;
    asm_intarith((ASMState *)&local_508[0].field_0,unaff_RBP,XOg_OR);
    goto switchD_00144850_caseD_c;
  case '#':
    pcStack_540 = (code *)0x145a6b;
    asm_intarith((ASMState *)&local_508[0].field_0,unaff_RBP,XOg_XOR);
    goto switchD_00144850_caseD_c;
  case '$':
    pcStack_540 = (code *)0x145277;
    asm_bitshift((ASMState *)&local_508[0].field_0,unaff_RBP,XOg_SHL,XV_SHLX);
    goto switchD_00144850_caseD_c;
  case '%':
    pcStack_540 = (code *)0x1454e7;
    asm_bitshift((ASMState *)&local_508[0].field_0,unaff_RBP,XOg_SHR,XV_SHRX);
    goto switchD_00144850_caseD_c;
  case '&':
    pcStack_540 = (code *)0x145118;
    asm_bitshift((ASMState *)&local_508[0].field_0,unaff_RBP,XOg_SAR,XV_SARX);
    goto switchD_00144850_caseD_c;
  case '\'':
    xs = XOg_ROL;
    goto LAB_00145a16;
  case '(':
    xs = XOg_ROR;
LAB_00145a16:
    pcStack_540 = (code *)0x145a1d;
    asm_bitshift((ASMState *)&local_508[0].field_0,unaff_RBP,xs,XOg_FADDq);
    goto switchD_00144850_caseD_c;
  case ')':
    uVar55 = (unaff_RBP->field_1).t.irt & 0x1f;
    if (uVar55 != 0xe) {
      if ((pSStack_3c0 != local_488) && ((0x604208U >> uVar55 & 1) == 0)) {
        uVar39 = (ulong)(unaff_RBP->field_0).op1;
        uVar58 = (ulong)(unaff_RBP->field_0).op2;
        local_464 = 0x8080;
        local_462 = 0;
        local_468 = 0;
        cVar4 = *(char *)((long)local_478 + uVar39 * 8 + 6);
        if (cVar4 < '\0') {
          if ((((unaff_RBP->field_0).op1 != (unaff_RBP->field_0).op2) &&
              (*(char *)((long)local_478 + uVar39 * 8 + 5) == ')')) &&
             ((local_40c < (unaff_RBP->field_0).op1 &&
              ((-1 < (short)(unaff_RBP->field_0).op2 ||
               (-1 < *(short *)((long)local_478 + uVar39 * 8 + 2))))))) {
            bVar15 = *(byte *)((long)local_478 + (ulong)local_478[uVar39].field_0.op1 * 8 + 6);
            RVar16 = (Reg)bVar15;
            if ((char)bVar15 < '\0') {
              pcStack_540 = (code *)0x14780c;
              RVar16 = ra_allocref((ASMState *)&local_508[0].field_0,
                                   (uint)local_478[uVar39].field_0.op1,0xffef);
            }
            bVar15 = (byte)RVar16 & 0x1f;
            uVar55 = (uint)uStack_458 & (-2 << bVar15 | 0xfffffffeU >> 0x20 - bVar15);
            uVar41 = ~(1 << (RVar16 & 0x1f)) & 0xffef;
            local_464 = CONCAT11(local_464._1_1_,(byte)RVar16);
            if ((short)(unaff_RBP->field_0).op2 < 0) {
              local_468 = local_478[*(ushort *)((long)pIVar34 + uVar39 * 8 + 2)].field_1.op12;
              uVar7 = (unaff_RBP->field_0).op2;
            }
            else {
              local_468 = pIVar34[uVar58].field_1.op12;
              uVar7 = *(ushort *)((long)pIVar34 + uVar39 * 8 + 2);
            }
            bVar15 = *(byte *)((long)local_478 + (ulong)uVar7 * 8 + 6);
            RVar16 = (Reg)bVar15;
            uStack_458._0_4_ = uVar55;
            if ((char)bVar15 < '\0') {
              pcStack_540 = (code *)0x147b17;
              RVar16 = ra_allocref((ASMState *)&local_508[0].field_0,(uint)uVar7,uVar41);
            }
            bVar15 = (byte)RVar16 & 0x1f;
            uStack_458 = CONCAT44(uStack_458._4_4_,
                                  (uint)uStack_458 & (-2 << bVar15 | 0xfffffffeU >> 0x20 - bVar15));
            RVar38 = uVar41 & ~(1 << (RVar16 & 0x1f));
            local_464 = CONCAT11((byte)RVar16,(char)local_464);
            goto LAB_00147b31;
          }
        }
        else {
          RVar38 = ~(1 << ((int)cVar4 & 0x1fU)) & 0xffef;
          uStack_458._0_4_ = (uint)uStack_458 & ~(1 << ((int)cVar4 & 0x1fU));
          uVar6 = *(undefined1 *)((long)local_478 + uVar39 * 8 + 6);
          local_464 = CONCAT11(0x80,uVar6);
          uVar7 = (unaff_RBP->field_0).op2;
          if (((short)uVar7 < 0) && (*(char *)((long)local_478 + uVar58 * 8 + 6) < '\0')) {
            if (((*(char *)((long)local_478 + uVar58 * 8 + 5) == ')') && (local_40c < uVar7)) &&
               (-1 < *(short *)((long)local_478 + uVar58 * 8 + 2))) {
              bVar15 = *(byte *)((long)local_478 + (ulong)local_478[uVar58].field_0.op1 * 8 + 6);
              RVar16 = (Reg)bVar15;
              if ((char)bVar15 < '\0') {
                pcStack_540 = (code *)0x147ab3;
                RVar16 = ra_allocref((ASMState *)&local_508[0].field_0,
                                     (uint)local_478[uVar58].field_0.op1,RVar38);
              }
              bVar15 = (byte)RVar16 & 0x1f;
              uStack_458 = CONCAT44(uStack_458._4_4_,
                                    (uint)uStack_458 & (-2 << bVar15 | 0xfffffffeU >> 0x20 - bVar15)
                                   );
              RVar38 = RVar38 & ~(1 << (RVar16 & 0x1f));
              local_464 = CONCAT11((byte)RVar16,(char)local_464);
              local_468 = local_478[*(ushort *)((long)pIVar34 + uVar58 * 8 + 2)].field_1.op12;
LAB_00147b31:
              pcStack_540 = (code *)0x147b43;
              RVar16 = ra_dest((ASMState *)&local_508[0].field_0,unaff_RBP,RVar38);
              xVar44 = XO_LEA;
              break;
            }
          }
          else {
            bVar15 = (unaff_RBP->field_1).r;
            if (((long)(char)bVar15 < 0) ||
               ((((*(byte *)((long)local_478 + uVar39 * 8 + 4) & 0x40) == 0 ||
                 (*(IRRef1 *)((long)&local_3b0 + (long)(char)bVar15 * 2) != (unaff_RBP->field_0).op1
                 )) && (((*(byte *)((long)local_478 + uVar58 * 8 + 4) & 0x40) == 0 ||
                        (*(ushort *)((long)&local_3b0 + (ulong)bVar15 * 2) != uVar7)))))) {
              if ((short)uVar7 < 0) {
                uVar55 = (uint)*(byte *)((long)local_478 + uVar58 * 8 + 6);
                RVar38 = RVar38 & ~(1 << (uVar55 & 0x1f));
                uStack_458 = CONCAT44(uStack_458._4_4_,(uint)uStack_458 & ~(1 << (uVar55 & 0x1f)));
                local_464 = CONCAT11(*(undefined1 *)((long)local_478 + uVar58 * 8 + 6),uVar6);
              }
              else {
                local_468 = local_478[uVar58].field_1.op12;
              }
              goto LAB_00147b31;
            }
          }
        }
      }
      goto switchD_00144850_caseD_35;
    }
    pcStack_540 = (code *)0x145a92;
    asm_fparith((ASMState *)&local_508[0].field_0,unaff_RBP,XO_ADDSD);
    goto switchD_00144850_caseD_c;
  case '*':
    if (((unaff_RBP->field_1).t.irt & 0x1f) != 0xe) goto switchD_00144850_caseD_36;
    pcStack_540 = (code *)0x145a3d;
    asm_fparith((ASMState *)&local_508[0].field_0,unaff_RBP,XO_SUBSD);
    goto switchD_00144850_caseD_c;
  case '+':
    if (((unaff_RBP->field_1).t.irt & 0x1f) != 0xe) goto switchD_00144850_caseD_37;
    pcStack_540 = (code *)0x145af2;
    asm_fparith((ASMState *)&local_508[0].field_0,unaff_RBP,XO_MULSD);
    goto switchD_00144850_caseD_c;
  case ',':
    bVar15 = (unaff_RBP->field_1).t.irt & 0x1f;
    if (bVar15 != 0xe) {
      id_00 = bVar15 == 0x15 ^ IRCALL_lj_carith_divu64;
      goto LAB_0014631d;
    }
    pcStack_540 = (code *)0x145867;
    asm_fparith((ASMState *)&local_508[0].field_0,unaff_RBP,XO_DIVSD);
    goto switchD_00144850_caseD_c;
  case '-':
    bVar15 = (unaff_RBP->field_1).t.irt & 0x1f;
    if (bVar15 == 0x13) {
      uVar12 = CONCAT24((unaff_RBP->field_0).op2,(uint)(unaff_RBP->field_0).op1);
      pCVar43 = lj_ir_callinfo + 0x23;
LAB_001457e7:
      local_138[0].func = (ASMFunction)(ulong)uVar12;
      pcStack_540 = (code *)0x1457fa;
      asm_setupresult((ASMState *)&local_508[0].field_0,unaff_RBP,pCVar43);
      goto LAB_00145800;
    }
    id_00 = bVar15 == 0x15 ^ IRCALL_lj_carith_modu64;
    goto LAB_0014631d;
  case '.':
    bVar15 = (unaff_RBP->field_1).t.irt & 0x1f;
    if (bVar15 == 0xe) {
      uVar12 = CONCAT24((unaff_RBP->field_0).op2,(uint)(unaff_RBP->field_0).op1);
      pCVar43 = lj_ir_callinfo + 0x38;
      goto LAB_001457e7;
    }
    id_00 = bVar15 == 0x15 ^ IRCALL_lj_carith_powu64;
LAB_0014631d:
    pcStack_540 = (code *)0x14632a;
    asm_callid((ASMState *)&local_508[0].field_0,unaff_RBP,id_00);
    goto switchD_00144850_caseD_c;
  case '/':
    if (((unaff_RBP->field_1).t.irt & 0x1f) == 0xe) {
      pcStack_540 = (code *)0x14582c;
      asm_fparith((ASMState *)&local_508[0].field_0,unaff_RBP,XO_XORPS);
    }
    else {
      pcStack_540 = (code *)0x14630e;
      asm_neg_not((ASMState *)&local_508[0].field_0,unaff_RBP,XOg_NEG);
    }
    goto switchD_00144850_caseD_c;
  case '0':
    pcStack_540 = (code *)0x145843;
    asm_fparith((ASMState *)&local_508[0].field_0,unaff_RBP,XO_ANDPS);
    goto switchD_00144850_caseD_c;
  case '1':
    bVar15 = (unaff_RBP->field_1).s;
    SVar56 = (uint)bVar15 * 4;
    bVar46 = (unaff_RBP->field_1).r;
    if (-1 < (char)bVar46) {
      uVar55 = 1 << (bVar46 & 0x1f);
      local_460 = CONCAT44(local_460._4_4_ | uVar55,(uint)local_460 | uVar55);
      pcStack_540 = (code *)0x14515e;
      emit_rmro((ASMState *)&local_508[0].field_0,XO_MOVSD,(int)(char)bVar46,4,SVar56);
    }
    if (bVar15 == 0) {
      bVar15 = 0x1c;
    }
    else if (bVar15 < 0x20) {
      *(byte *)((long)local_488 + -1) = (byte)SVar56;
      local_488 = (SnapEntry *)((long)local_488 + -1);
      bVar15 = 0x5c;
    }
    else {
      local_488[-1] = SVar56;
      local_488 = local_488 + -1;
      bVar15 = 0x9c;
    }
    *(byte *)((long)local_488 + -1) = 0x24;
    *(byte *)((long)local_488 + -2) = bVar15;
    *(byte *)((long)local_488 + -3) = 0xdd;
    ((byte *)((long)local_488 + -5))[0] = 0xdd;
    ((byte *)((long)local_488 + -5))[1] = 0xd9;
    ((byte *)((long)local_488 + -7))[0] = 0xd9;
    ((byte *)((long)local_488 + -7))[1] = 0xfd;
    local_488 = (SnapEntry *)((long)local_488 + -7);
    pcStack_540 = (code *)0x146997;
    asm_x87load((ASMState *)&local_508[0].field_0,(uint)(unaff_RBP->field_0).op1);
    pcStack_540 = (code *)0x1469a3;
    asm_x87load((ASMState *)&local_508[0].field_0,(uint)(unaff_RBP->field_0).op2);
    goto switchD_00144850_caseD_c;
  case '2':
    if (((unaff_RBP->field_1).t.irt & 0x1f) == 0xe) {
      pcStack_540 = (code *)0x144f8c;
      asm_fparith((ASMState *)&local_508[0].field_0,unaff_RBP,XO_MINSD);
    }
    else {
      pcStack_540 = (code *)0x146143;
      asm_intmin_max((ASMState *)&local_508[0].field_0,unaff_RBP,0xf);
    }
    goto switchD_00144850_caseD_c;
  case '3':
    if (((unaff_RBP->field_1).t.irt & 0x1f) == 0xe) {
      pcStack_540 = (code *)0x145cc6;
      asm_fparith((ASMState *)&local_508[0].field_0,unaff_RBP,XO_MAXSD);
    }
    else {
      pcStack_540 = (code *)0x14655f;
      asm_intmin_max((ASMState *)&local_508[0].field_0,unaff_RBP,0xc);
    }
    goto switchD_00144850_caseD_c;
  case '4':
    uVar7 = (unaff_RBP->field_0).op2;
    if (uVar7 != 3) {
      if (uVar7 < 3) {
        if ((local_450 & 0x20) == 0) {
          bVar15 = (unaff_RBP->field_1).r & 0x1f;
          RVar38 = (-2 << bVar15 | 0xfffffffeU >> 0x20 - bVar15) & 0xf0001;
          if ((char)(unaff_RBP->field_1).r < '\0') {
            RVar38 = 0xf0001;
          }
          pcStack_540 = (code *)0x1460e9;
          ra_evictset((ASMState *)&local_508[0].field_0,RVar38);
          pcStack_540 = (code *)0x1460f9;
          ra_destreg((ASMState *)&local_508[0].field_0,unaff_RBP,0x10);
          pcVar35 = lj_vm_trunc;
          if (uVar7 == 1) {
            pcVar35 = lj_vm_ceil;
          }
          target = lj_vm_floor;
          if (uVar7 != 0) {
            target = pcVar35;
          }
          pcStack_540 = (code *)0x146123;
          emit_call_((ASMState *)&local_508[0].field_0,(MCode *)target);
          pcStack_540 = (code *)0x146134;
          ra_left((ASMState *)&local_508[0].field_0,0x10,(uint)(unaff_RBP->field_0).op1);
        }
        else {
          pcStack_540 = (code *)0x146f0e;
          RVar16 = ra_dest((ASMState *)&local_508[0].field_0,unaff_RBP,0xffff0000);
          pcStack_540 = (code *)0x146f22;
          RVar18 = asm_fuseload((ASMState *)&local_508[0].field_0,(uint)(unaff_RBP->field_0).op1,
                                0xffff0000);
          *(byte *)((long)local_488 + -1) = (char)uVar7 + 9;
          pcStack_540 = (code *)0x146f4c;
          local_488 = (SnapEntry *)((long)local_488 + -1);
          emit_mrm((ASMState *)&local_508[0].field_0,XO_ROUNDSD,RVar16,RVar18);
          pSVar42 = local_488;
          if (*(byte *)((long)local_488 + 1) != 0x3a) {
            *(byte *)local_488 = *(byte *)((long)local_488 + 1);
            *(byte *)((long)local_488 + 1) = 0xf;
          }
          local_488 = (SnapEntry *)((long)local_488 + -1);
          *(byte *)((long)pSVar42 + -1) = 0x66;
        }
      }
      else {
        pcStack_540 = (code *)0x1469ed;
        asm_callid((ASMState *)&local_508[0].field_0,unaff_RBP,uVar7 + IRCALL_lj_vm_floor);
      }
      goto switchD_00144850_caseD_c;
    }
    pcStack_540 = (code *)0x144e46;
    RVar18 = ra_dest((ASMState *)&local_508[0].field_0,unaff_RBP,0xffff0000);
    pcStack_540 = (code *)0x144e5a;
    RVar16 = asm_fuseload((ASMState *)&local_508[0].field_0,(uint)(unaff_RBP->field_0).op1,
                          0xffff0000);
    xVar44 = XO_SQRTSD;
    goto LAB_00144e65;
  case '5':
switchD_00144850_caseD_35:
    pcStack_540 = (code *)0x1475fe;
    asm_intarith((ASMState *)&local_508[0].field_0,unaff_RBP,XOg_ADD);
    goto switchD_00144850_caseD_c;
  case '6':
switchD_00144850_caseD_36:
    pcStack_540 = (code *)0x145a54;
    asm_intarith((ASMState *)&local_508[0].field_0,unaff_RBP,XOg_SUB);
    goto switchD_00144850_caseD_c;
  case '7':
switchD_00144850_caseD_37:
    pcStack_540 = (code *)0x145b09;
    asm_intarith((ASMState *)&local_508[0].field_0,unaff_RBP,XOg_X_IMUL);
    goto switchD_00144850_caseD_c;
  case '8':
    pcStack_540 = (code *)0x14508a;
    RVar16 = ra_dest((ASMState *)&local_508[0].field_0,unaff_RBP,0xffef);
    pcStack_540 = (code *)0x14509c;
    asm_fusearef((ASMState *)&local_508[0].field_0,unaff_RBP,0xffef);
    xVar44 = XO_LEA;
    break;
  case '9':
    local_530 = (IRIns *)(ulong)local_478[(unaff_RBP->field_0).op2].field_0.op1;
    uVar7 = *(ushort *)((long)local_478 + (ulong)(unaff_RBP->field_0).op2 * 8 + 2);
    if (((char)(unaff_RBP->field_1).r < '\0') && ((unaff_RBP->field_1).s == '\0')) {
      RVar16 = 0x80;
    }
    else {
      pcStack_540 = (code *)0x14596f;
      RVar16 = ra_dest((ASMState *)&local_508[0].field_0,unaff_RBP,0xffef);
    }
    bVar15 = *(byte *)((long)local_478 + (ulong)(unaff_RBP->field_0).op1 * 8 + 6);
    uVar39 = (ulong)bVar15;
    if ((char)bVar15 < '\0') {
      pcStack_540 = (code *)0x145996;
      RVar18 = ra_allocref((ASMState *)&local_508[0].field_0,(uint)(unaff_RBP->field_0).op1,0xffef);
      uVar39 = (ulong)RVar18;
    }
    iVar27 = (uint)uVar7 * 0x18;
    RVar18 = (Reg)uVar39;
    bVar15 = (byte)uVar39;
    uStack_458 = CONCAT44(uStack_458._4_4_,
                          (uint)uStack_458 &
                          (-2 << (bVar15 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar15 & 0x1f)));
    if (RVar16 < 0x80) {
      if (uVar7 == 0) {
        if (RVar16 != RVar18) {
          *(byte *)((long)local_488 + -1) = (bVar15 & 7) + (char)RVar16 * '\b' | 0xc0;
          *(byte *)((long)local_488 + -2) = 0x8b;
          uVar55 = (uint)(uVar39 >> 3) & 1 | RVar16 >> 1 & 4;
          if (uVar55 == 0) {
            local_488 = (SnapEntry *)((long)local_488 + -2);
          }
          else {
            *(byte *)((long)local_488 + -3) = (byte)uVar55 | 0x40;
            local_488 = (SnapEntry *)((long)local_488 + -3);
          }
        }
      }
      else if (RVar16 == RVar18) {
        pcStack_540 = (code *)0x1459ed;
        emit_gri((ASMState *)&local_508[0].field_0,0x838100,RVar16,iVar27);
      }
      else {
        pcStack_540 = (code *)0x146dc8;
        emit_rmro((ASMState *)&local_508[0].field_0,XO_LEA,RVar16,RVar18,iVar27);
      }
    }
    pcStack_540 = (code *)0x1476a5;
    asm_guardcc((ASMState *)&local_508[0].field_0,5);
    pIVar22 = local_530;
    bVar46 = *(byte *)((long)pIVar34 + (long)local_530 * 8 + 4) & 0x1f;
    if (bVar46 < 3) {
      *(byte *)((long)local_488 + -1) = ~bVar46;
      unaff_RBP = (IRIns *)(ulong)(iVar27 + 0xcU);
      pcStack_540 = (code *)0x1476e8;
      local_488 = (SnapEntry *)((long)local_488 + -1);
      emit_rmro((ASMState *)&local_508[0].field_0,XO_ARITHi8,7,RVar18,iVar27 + 0xcU);
    }
    else {
      pcStack_540 = (code *)0x147707;
      RVar16 = ra_scratch((ASMState *)&local_508[0].field_0,~(1 << (bVar15 & 0x1f)) & 0xffef);
      unaff_RBP = (IRIns *)(ulong)(iVar27 + 8U);
      pcStack_540 = (code *)0x147727;
      emit_rmro((ASMState *)&local_508[0].field_0,XO_CMP,RVar16 | 0x80200,RVar18,iVar27 + 8U);
      bVar15 = *(byte *)((long)pIVar34 + (long)pIVar22 * 8 + 4) & 0x1f;
      if (bVar15 == 0xe) {
        IVar40 = pIVar34[(long)pIVar22 + 1];
      }
      else {
        IVar40 = (IRIns)(long)CONCAT14(~bVar15,pIVar34[(long)pIVar22].field_1.op12);
      }
      pcStack_540 = (code *)0x147757;
      emit_loadu64((ASMState *)&local_508[0].field_0,RVar16,(uint64_t)IVar40);
    }
    goto switchD_00144850_caseD_c;
  case ':':
    pcStack_540 = (code *)0x145cda;
    asm_href((ASMState *)&local_508[0].field_0,unaff_RBP,IR_LT);
    goto switchD_00144850_caseD_c;
  case ';':
    if ((unaff_RBP->field_1).r != 0xfe) {
      pcStack_540 = (code *)0x144fff;
      asm_snap_prep((ASMState *)&local_508[0].field_0);
      local_138[0].func = (ASMFunction)(ulong)CONCAT24((unaff_RBP->field_0).op1,0x7fff);
      local_138[0].flags = 0x7ffd;
      pcStack_540 = (code *)0x145033;
      asm_setupresult((ASMState *)&local_508[0].field_0,unaff_RBP,lj_ir_callinfo + 0x1d);
      pcStack_540 = (code *)0x145041;
      asm_gencall((ASMState *)&local_508[0].field_0,lj_ir_callinfo + 0x1d,(IRRef *)local_138);
      RVar16 = (Reg)*(byte *)((long)local_478 + 0x3ffee);
      uVar55 = 1 << (*(byte *)((long)local_478 + 0x3ffee) & 0x1f);
      local_460 = CONCAT44(local_460._4_4_ | uVar55,(uint)local_460 | uVar55);
      *(undefined1 *)((long)local_478 + 0x3ffee) = 0xff;
      IVar37 = (IRRef)(unaff_RBP->field_0).op2;
      goto LAB_00146bad;
    }
    goto switchD_00144850_caseD_c;
  case '<':
  case '=':
    pcStack_540 = (code *)0x144a2e;
    RVar16 = ra_dest((ASMState *)&local_508[0].field_0,unaff_RBP,0xffef);
    if (-1 < (long)(short)(unaff_RBP->field_0).op1) {
      local_488[-1] =
           *(int *)((ulong)local_478[(short)(unaff_RBP->field_0).op1].field_1.op12 + 0x14 +
                   (ulong)*(byte *)((long)&(unaff_RBP->field_0).op2 + 1) * 4) + 0x10;
      *(byte *)((long)local_488 + -5) = 0x25;
      *(byte *)((long)local_488 + -6) = (char)RVar16 * '\b' & 0x38U | 4;
      *(byte *)((long)local_488 + -7) = 0x8b;
      if ((RVar16 & 8) == 0) {
        local_488 = (SnapEntry *)((long)local_488 + -7);
      }
      else {
        *(byte *)(local_488 + -2) = 0x44;
        local_488 = local_488 + -2;
      }
      goto LAB_001475aa;
    }
    pcStack_540 = (code *)0x145f3f;
    RVar18 = ra_scratch((ASMState *)&local_508[0].field_0,0xffef);
    bVar15 = *(byte *)((long)local_478 + (ulong)(unaff_RBP->field_0).op1 * 8 + 6);
    rb = (Reg)bVar15;
    if ((char)bVar15 < '\0') {
      pcStack_540 = (code *)0x145f67;
      rb = ra_allocref((ASMState *)&local_508[0].field_0,(uint)(unaff_RBP->field_0).op1,0xffef);
    }
    bVar15 = (byte)rb & 0x1f;
    uStack_458 = CONCAT44(uStack_458._4_4_,
                          (uint)uStack_458 & (-2 << bVar15 | 0xfffffffeU >> 0x20 - bVar15));
    if ((unaff_RBP->field_1).o == '=') {
      pcStack_540 = (code *)0x145fa2;
      emit_rmro((ASMState *)&local_508[0].field_0,XO_LEA,RVar16,RVar18,8);
      pcStack_540 = (code *)0x145faf;
      asm_guardcc((ASMState *)&local_508[0].field_0,5);
      *(byte *)((long)local_488 + -1) = 1;
      xVar44 = XO_ARITHib;
      RVar16 = 7;
      iVar54 = 6;
      local_488 = (SnapEntry *)((long)local_488 + -1);
    }
    else {
      xVar44 = XO_MOV;
      iVar54 = 0x10;
    }
    pcStack_540 = (code *)0x14678f;
    emit_rmro((ASMState *)&local_508[0].field_0,xVar44,RVar16,RVar18,iVar54);
    pcStack_540 = (code *)0x1467b0;
    emit_rmro((ASMState *)&local_508[0].field_0,XO_MOV,RVar18,rb,
              (uint)*(byte *)((long)&(unaff_RBP->field_0).op2 + 1) * 4 + 0x14);
    goto switchD_00144850_caseD_c;
  case '>':
    pcStack_540 = (code *)0x144db0;
    RVar16 = ra_dest((ASMState *)&local_508[0].field_0,unaff_RBP,0xffef);
    pcStack_540 = (code *)0x144dc3;
    asm_fusefref((ASMState *)&local_508[0].field_0,unaff_RBP,0xffef);
    xVar44 = XO_LEA;
    break;
  case '?':
    pcStack_540 = (code *)0x144de8;
    RVar16 = ra_dest((ASMState *)&local_508[0].field_0,unaff_RBP,0xffef);
    pcStack_540 = (code *)0x144dfa;
    asm_fusestrref((ASMState *)&local_508[0].field_0,unaff_RBP,0xffef);
    if ((char)local_464 == -0x80) {
      pcStack_540 = (code *)0x144e1f;
      emit_loadi((ASMState *)&local_508[0].field_0,RVar16,local_468);
      goto switchD_00144850_caseD_c;
    }
    xVar44 = XO_LEA;
    break;
  case '@':
    pcStack_540 = (code *)0x145aac;
    RVar16 = ra_dest((ASMState *)&local_508[0].field_0,unaff_RBP,0xffef);
    pcStack_540 = (code *)0x145abb;
    ra_left((ASMState *)&local_508[0].field_0,RVar16,0x7fff);
    goto switchD_00144850_caseD_c;
  case 'A':
  case 'B':
  case 'C':
  case 'G':
    bVar15 = (unaff_RBP->field_1).t.irt & 0x1f;
    if (bVar15 == 3) {
      pcStack_540 = (code *)0x144883;
      RVar16 = asm_load_lightud64((ASMState *)&local_508[0].field_0,unaff_RBP,1);
      if (0x7f < RVar16) goto switchD_00144850_caseD_c;
      if (local_488 < local_480) goto LAB_0014869c;
      pcStack_540 = (code *)0x1448ba;
      asm_fuseahuref((ASMState *)&local_508[0].field_0,(uint)(unaff_RBP->field_0).op1,0xffef);
      RVar16 = RVar16 | 0x80200;
      xVar44 = XO_MOV;
    }
    else {
      if (((char)(unaff_RBP->field_1).r < '\0') && ((unaff_RBP->field_1).s == '\0')) {
        pcStack_540 = (code *)0x1469bb;
        asm_fuseahuref((ASMState *)&local_508[0].field_0,(uint)(unaff_RBP->field_0).op1,0xffef);
      }
      else {
        RVar38 = 0xffff0000;
        if (bVar15 != 0xe) {
          RVar38 = 0xffef;
        }
        pcStack_540 = (code *)0x144b1b;
        RVar16 = ra_dest((ASMState *)&local_508[0].field_0,unaff_RBP,RVar38);
        pcStack_540 = (code *)0x144b2f;
        asm_fuseahuref((ASMState *)&local_508[0].field_0,(uint)(unaff_RBP->field_0).op1,0xffef);
        xVar44 = XO_MOVSD;
        if (RVar16 < 0x10) {
          xVar44 = XO_MOV;
        }
        pcStack_540 = (code *)0x144b50;
        emit_mrm((ASMState *)&local_508[0].field_0,xVar44,RVar16,0x20);
      }
      local_468 = local_468 + 4;
      pcStack_540 = (code *)0x144b74;
      asm_guardcc((ASMState *)&local_508[0].field_0,
                  (uint)(((unaff_RBP->field_1).t.irt & 0x1f) != 0xe) * 2 + 3);
      bVar15 = (unaff_RBP->field_1).t.irt & 0x1f;
      if (bVar15 < 0xe) {
        *(byte *)((long)local_488 + -1) = ~bVar15;
        xVar44 = XO_ARITHi8;
        local_488 = (SnapEntry *)((long)local_488 + -1);
      }
      else {
        if (local_488 < local_480) goto LAB_0014869c;
        local_488[-1] = 0xfffeffff;
        xVar44 = XO_ARITHi;
        local_488 = local_488 + -1;
      }
      RVar16 = 7;
    }
    break;
  case 'D':
  case 'E':
    pcStack_540 = (code *)0x144aa8;
    asm_fxload((ASMState *)&local_508[0].field_0,unaff_RBP);
    goto switchD_00144850_caseD_c;
  case 'F':
    uVar7 = (unaff_RBP->field_0).op2;
    iVar27 = ((uint)uVar7 + (uint)uVar7 & 4) + (uint)(unaff_RBP->field_0).op1 * 8;
    iVar54 = iVar27 + -8;
    bVar15 = (byte)(unaff_RBP->field_0).ot;
    if (((bVar15 & 0x9f) == 0x93 & (byte)(uVar7 >> 3) & 0x1f) == 1) {
      pcStack_540 = (code *)0x14531b;
      RVar16 = ra_scratch((ASMState *)&local_508[0].field_0,0xffff0000);
      pcStack_540 = (code *)0x14532b;
      asm_tointg((ASMState *)&local_508[0].field_0,unaff_RBP,RVar16);
      RVar18 = (Reg)*(byte *)((long)local_478 + 0x40006);
      if ((char)*(byte *)((long)local_478 + 0x40006) < '\0') {
        pcStack_540 = (code *)0x145351;
        RVar18 = ra_allocref((ASMState *)&local_508[0].field_0,0x8000,0xffef);
      }
      bVar15 = (byte)RVar18 & 0x1f;
      uStack_458 = CONCAT44(uStack_458._4_4_,
                            (uint)uStack_458 & (-2 << bVar15 | 0xfffffffeU >> 0x20 - bVar15));
      pcStack_540 = (code *)0x145379;
      emit_rmro((ASMState *)&local_508[0].field_0,XO_MOVSD,RVar16,RVar18,iVar54);
      bVar15 = 0xe;
    }
    else {
      bVar46 = bVar15 & 0x1f;
      if (bVar46 == 3) {
        pcStack_540 = (code *)0x146206;
        RVar16 = asm_load_lightud64((ASMState *)&local_508[0].field_0,unaff_RBP,uVar7 & 4);
        if (0x7f < RVar16) goto switchD_00144850_caseD_c;
        RVar18 = (Reg)*(byte *)((long)local_478 + 0x40006);
        if ((char)*(byte *)((long)local_478 + 0x40006) < '\0') {
          pcStack_540 = (code *)0x146238;
          RVar18 = ra_allocref((ASMState *)&local_508[0].field_0,0x8000,0xffef);
        }
        bVar15 = (byte)RVar18 & 0x1f;
        uStack_458 = CONCAT44(uStack_458._4_4_,
                              (uint)uStack_458 & (-2 << bVar15 | 0xfffffffeU >> 0x20 - bVar15));
        RVar16 = RVar16 | 0x80200;
        xVar44 = XO_MOV;
        goto LAB_0014709a;
      }
      if (((char)(unaff_RBP->field_1).r < '\0') && ((unaff_RBP->field_1).s == '\0')) {
        if ((uVar7 & 4) != 0) {
          RVar18 = (Reg)*(byte *)((long)local_478 + 0x40006);
          if ((char)*(byte *)((long)local_478 + 0x40006) < '\0') {
            pcStack_540 = (code *)0x147673;
            RVar18 = ra_allocref((ASMState *)&local_508[0].field_0,0x8000,0xffef);
          }
          bVar46 = (byte)RVar18 & 0x1f;
          uStack_458 = CONCAT44(uStack_458._4_4_,
                                (uint)uStack_458 & (-2 << bVar46 | 0xfffffffeU >> 0x20 - bVar46));
          goto LAB_00147015;
        }
        goto switchD_00144850_caseD_c;
      }
      RVar38 = 0xffef;
      if (bVar46 == 0xe) {
        RVar38 = 0xffff0000;
      }
      pcStack_540 = (code *)0x146a23;
      RVar16 = ra_dest((ASMState *)&local_508[0].field_0,unaff_RBP,RVar38);
      RVar18 = (Reg)*(byte *)((long)local_478 + 0x40006);
      if ((char)*(byte *)((long)local_478 + 0x40006) < '\0') {
        pcStack_540 = (code *)0x146a4c;
        RVar18 = ra_allocref((ASMState *)&local_508[0].field_0,0x8000,0xffef);
      }
      bVar11 = (byte)RVar18 & 0x1f;
      uStack_458 = CONCAT44(uStack_458._4_4_,
                            (uint)uStack_458 & (-2 << bVar11 | 0xfffffffeU >> 0x20 - bVar11));
      if (((unaff_RBP->field_0).op2 & 8) == 0) {
        xVar44 = XO_MOV;
        if (bVar46 == 0xe) {
          xVar44 = XO_MOVSD;
        }
      }
      else {
        bVar15 = (bVar46 != 0x13) * '\x05' + 0xe;
        xVar44 = (uint)(bVar46 == 0x13) * 0x2000000 + XO_CVTSI2SD;
      }
      pcStack_540 = (code *)0x147015;
      emit_rmro((ASMState *)&local_508[0].field_0,xVar44,RVar16,RVar18,iVar54);
    }
LAB_00147015:
    if (((unaff_RBP->field_0).op2 & 4) == 0) goto switchD_00144850_caseD_c;
    bVar15 = bVar15 & 0x1f;
    pcStack_540 = (code *)0x14703d;
    asm_guardcc((ASMState *)&local_508[0].field_0,(uint)(bVar15 != 0xe) * 2 + 3);
    if (bVar15 < 0xe) {
      *(byte *)((long)local_488 + -1) = ~bVar15;
      xVar44 = XO_ARITHi8;
      local_488 = (SnapEntry *)((long)local_488 + -1);
    }
    else {
      local_488[-1] = 0xfffeffff;
      xVar44 = XO_ARITHi;
      local_488 = local_488 + -1;
    }
    iVar54 = iVar27 + -4;
    RVar16 = 7;
LAB_0014709a:
    pcStack_540 = (code *)0x1470a2;
    emit_rmro((ASMState *)&local_508[0].field_0,xVar44,RVar16,RVar18,iVar54);
    goto switchD_00144850_caseD_c;
  case 'H':
  case 'I':
  case 'J':
    if ((unaff_RBP->field_1).r == 0xfe) goto switchD_00144850_caseD_c;
    bVar15 = (unaff_RBP->field_1).t.irt & 0x1f;
    if (bVar15 == 3) {
      bVar15 = *(byte *)((long)local_478 + (ulong)(unaff_RBP->field_0).op2 * 8 + 6);
      RVar16 = (Reg)bVar15;
      if ((char)bVar15 < '\0') {
        pcStack_540 = (code *)0x146588;
        RVar16 = ra_allocref((ASMState *)&local_508[0].field_0,(uint)(unaff_RBP->field_0).op2,0xffef
                            );
      }
      bVar15 = (byte)RVar16 & 0x1f;
      uStack_458 = CONCAT44(uStack_458._4_4_,
                            (uint)uStack_458 & (-2 << bVar15 | 0xfffffffeU >> 0x20 - bVar15));
      pcStack_540 = (code *)0x1465b3;
      asm_fuseahuref((ASMState *)&local_508[0].field_0,(uint)(unaff_RBP->field_0).op1,
                     ~(1 << (RVar16 & 0x1f)) & 0xffef);
      RVar16 = RVar16 | 0x80200;
      xVar44 = XO_MOVto;
    }
    else if (bVar15 == 0xe) {
      bVar15 = *(byte *)((long)local_478 + (ulong)(unaff_RBP->field_0).op2 * 8 + 6);
      RVar16 = (Reg)bVar15;
      if ((char)bVar15 < '\0') {
        pcStack_540 = (code *)0x144914;
        RVar16 = ra_allocref((ASMState *)&local_508[0].field_0,(uint)(unaff_RBP->field_0).op2,
                             0xffff0000);
      }
      bVar15 = (byte)RVar16 & 0x1f;
      uStack_458 = CONCAT44(uStack_458._4_4_,
                            (uint)uStack_458 & (-2 << bVar15 | 0xfffffffeU >> 0x20 - bVar15));
      pcStack_540 = (code *)0x14493c;
      asm_fuseahuref((ASMState *)&local_508[0].field_0,(uint)(unaff_RBP->field_0).op1,0xffef);
      xVar44 = XO_MOVSDto;
    }
    else {
      uVar7 = (unaff_RBP->field_0).op2;
      uVar39 = (ulong)uVar7;
      if ((short)uVar7 < 0) {
        bVar15 = *(byte *)((long)local_478 + uVar39 * 8 + 6);
        RVar16 = (Reg)bVar15;
        if ((char)bVar15 < '\0') {
          pcStack_540 = (code *)0x146c8b;
          RVar16 = ra_allocref((ASMState *)&local_508[0].field_0,(uint)uVar7,0xffef);
        }
        bVar15 = (byte)RVar16 & 0x1f;
        uStack_458 = CONCAT44(uStack_458._4_4_,
                              (uint)uStack_458 & (-2 << bVar15 | 0xfffffffeU >> 0x20 - bVar15));
        RVar38 = ~(1 << (RVar16 & 0x1f)) & 0xffef;
      }
      else {
        RVar16 = 0x80;
        RVar38 = 0xffef;
      }
      pcStack_540 = (code *)0x146cb6;
      asm_fuseahuref((ASMState *)&local_508[0].field_0,(uint)(unaff_RBP->field_0).op1,RVar38);
      if (RVar16 < 0x80) {
        xVar44 = XO_MOVto;
LAB_00146cfb:
        pcStack_540 = (code *)0x146d05;
        emit_mrm((ASMState *)&local_508[0].field_0,xVar44,RVar16,0x20);
      }
      else if (2 < (*(byte *)((long)pIVar34 + uVar39 * 8 + 4) & 0x1f)) {
        local_488[-1] = pIVar34[uVar39].field_1.op12;
        local_488 = local_488 + -1;
        xVar44 = XO_MOVmi;
        RVar16 = 0;
        goto LAB_00146cfb;
      }
      local_468 = local_468 + 4;
      local_488[-1] = (int)(char)(~(unaff_RBP->field_1).t.irt | 0xe0);
      local_488 = local_488 + -1;
      xVar44 = XO_MOVmi;
      RVar16 = 0;
    }
    break;
  case 'K':
  case 'L':
    pcStack_540 = (code *)0x144a96;
    asm_fxstore((ASMState *)&local_508[0].field_0,unaff_RBP);
    goto switchD_00144850_caseD_c;
  case 'M':
  case 'N':
    pcStack_540 = (code *)0x1449eb;
    asm_snap_prep((ASMState *)&local_508[0].field_0);
    IVar47 = (unaff_RBP->field_0).op1;
    local_138[0].flags = (uint32_t)(unaff_RBP->field_0).op2;
    local_400 = CONCAT44(local_400._4_4_ + 1,(BCReg)local_400);
    pCVar43 = lj_ir_callinfo + 2;
    goto LAB_00144c94;
  case 'O':
    pcStack_540 = (code *)0x145193;
    asm_snap_prep((ASMState *)&local_508[0].field_0);
    local_138[0].func = (ASMFunction)0x7ffd00007fff;
    local_400 = CONCAT44(local_400._4_4_ + 1,(BCReg)local_400);
    pcStack_540 = (code *)0x1451c3;
    asm_setupresult((ASMState *)&local_508[0].field_0,unaff_RBP,lj_ir_callinfo + 0x1a);
    pcStack_540 = (code *)0x1451d1;
    asm_gencall((ASMState *)&local_508[0].field_0,lj_ir_callinfo + 0x1a,(IRRef *)local_138);
    RVar16 = (Reg)*(byte *)((long)local_478 + 0x3ffee);
    uVar55 = 1 << (*(byte *)((long)local_478 + 0x3ffee) & 0x1f);
    local_460 = CONCAT44(local_460._4_4_ | uVar55,(uint)local_460 | uVar55);
    *(undefined1 *)((long)local_478 + 0x3ffee) = 0xff;
    uVar55 = (uint)(unaff_RBP->field_0).op2 << 0x18 | (uint)(unaff_RBP->field_0).op1;
    goto LAB_00146ee2;
  case 'P':
    pcStack_540 = (code *)0x144c70;
    asm_snap_prep((ASMState *)&local_508[0].field_0);
    IVar47 = (unaff_RBP->field_0).op1;
    local_400 = CONCAT44(local_400._4_4_ + 1,(BCReg)local_400);
    pCVar43 = lj_ir_callinfo + 0x1b;
LAB_00144c94:
    local_138[0].func = (ASMFunction)(ulong)CONCAT24(IVar47,0x7fff);
    pcStack_540 = (code *)0x144ca2;
    asm_setupresult((ASMState *)&local_508[0].field_0,unaff_RBP,pCVar43);
    pcStack_540 = (code *)0x144cb0;
    asm_gencall((ASMState *)&local_508[0].field_0,pCVar43,(IRRef *)local_138);
    goto switchD_00144850_caseD_c;
  case 'Q':
  case 'R':
    id = local_478[(unaff_RBP->field_0).op1].field_1.op12;
    pcStack_540 = (code *)0x144978;
    CVar17 = lj_ctype_info((CTState *)(ulong)local_470[-1].bpropcache[0xc].mode,id,
                           (CTSize *)&local_150.i);
    local_400 = CONCAT44(local_400._4_4_ + 1,(BCReg)local_400);
    pcStack_540 = (code *)0x144994;
    asm_setupresult((ASMState *)&local_508[0].field_0,unaff_RBP,lj_ir_callinfo + 0x21);
    if ((unaff_RBP->field_1).o == 'R') {
      uVar55 = 0x80200;
      if (local_150.field_1.op12 != 8) {
        uVar55 = 0;
      }
      uVar7 = (unaff_RBP->field_0).op2;
      uVar39 = (ulong)uVar7;
      bVar15 = (byte)(uVar55 >> 0x10);
      if ((short)uVar7 < 0) {
        bVar46 = *(byte *)((long)local_478 + uVar39 * 8 + 6);
        RVar16 = (Reg)bVar46;
        if ((char)bVar46 < '\0') {
          pcStack_540 = (code *)0x146715;
          RVar16 = ra_allocref((ASMState *)&local_508[0].field_0,(uint)uVar7,0xf028);
        }
        bVar46 = (byte)RVar16 & 0x1f;
        uStack_458 = CONCAT44(uStack_458._4_4_,
                              (uint)uStack_458 & (-2 << bVar46 | 0xfffffffeU >> 0x20 - bVar46));
        *(byte *)((long)local_488 + -1) = 8;
        *(byte *)((long)local_488 + -2) = (byte)RVar16 * '\b' & 0x38 | 0x40;
        *(byte *)((long)local_488 + -3) = 0x89;
        uVar55 = (RVar16 | uVar55) >> 1 & 0x104;
        if (uVar55 == 0) {
          local_488 = (SnapEntry *)((long)local_488 + -3);
        }
        else {
          *(byte *)(local_488 + -1) = (byte)uVar55 | bVar15 | 0x40;
          local_488 = local_488 + -1;
        }
      }
      else {
        if (*(char *)((long)local_478 + uVar39 * 8 + 5) == '\x1d') {
          IVar40 = local_478[uVar39 + 1];
        }
        else {
          IVar40._4_4_ = 0;
          IVar40.field_1.op12 = local_478[uVar39].field_1.op12;
        }
        if ((local_150.field_1.op12 == 4) || ((long)IVar40 + 0x80000000U >> 0x20 == 0)) {
          local_488[-1] = IVar40.i;
          *(byte *)((long)local_488 + -5) = 8;
          ((byte *)((long)local_488 + -7))[0] = 199;
          ((byte *)((long)local_488 + -7))[1] = 0x40;
          if ((uVar55 >> 9 & 1) == 0) {
            local_488 = (SnapEntry *)((long)local_488 + -7);
          }
          else {
            *(byte *)(local_488 + -2) = bVar15 | 0x40;
            local_488 = local_488 + -2;
          }
        }
        else {
          *(byte *)((long)local_488 + -1) = 8;
          ((byte *)((long)local_488 + -3))[0] = 0x89;
          ((byte *)((long)local_488 + -3))[1] = 0x48;
          if ((uVar55 >> 9 & 1) == 0) {
            local_488 = (SnapEntry *)((long)local_488 + -3);
          }
          else {
            *(byte *)(local_488 + -1) = bVar15 | 0x40;
            local_488 = local_488 + -1;
          }
          pcStack_540 = (code *)0x146db4;
          emit_loadu64((ASMState *)&local_508[0].field_0,1,(uint64_t)IVar40);
        }
      }
    }
    else if ((unaff_RBP->field_0).op2 != 0x7fff) {
      local_138[0].func = (ASMFunction)(ulong)CONCAT24((unaff_RBP->field_0).op1,0x7fff);
      local_138[0]._12_4_ = 0x7ffd;
      pcStack_540 = (code *)0x144eb3;
      local_138[0].flags = (uint)(unaff_RBP->field_0).op2;
      asm_gencall((ASMState *)&local_508[0].field_0,lj_ir_callinfo + 0x5c,(IRRef *)local_138);
      bVar15 = *(byte *)((long)local_478 + 0x3ffee);
      uVar55 = 1 << (bVar15 & 0x1f);
      local_460 = CONCAT44(local_460._4_4_ | uVar55,(uint)local_460 | uVar55);
      *(undefined1 *)((long)local_478 + 0x3ffee) = 0xff;
      pcStack_540 = (code *)0x144ef0;
      emit_loadi((ASMState *)&local_508[0].field_0,(uint)bVar15,CVar17 >> 0x10 & 0xf);
      goto switchD_00144850_caseD_c;
    }
    *(byte *)((long)local_488 + -1) = 1;
    *(int *)((long)local_488 + -5) = (int)local_470 + -0x168;
    *(byte *)((long)local_488 + -6) = 0x25;
    *(undefined2 *)(local_488 + -2) = 0x483;
    *(byte *)((long)local_488 + -9) = 4;
    ((byte *)((long)local_488 + -0xb))[0] = 0x89;
    ((byte *)((long)local_488 + -0xb))[1] = 0x48;
    *(CTypeID *)((long)local_488 + -0xf) = id << 0x10 | 0xa00;
    ((byte *)((long)local_488 + -0x11))[0] = 0x81;
    ((byte *)((long)local_488 + -0x11))[1] = 0xc9;
    *(byte *)((long)local_488 + -0x12) = 3;
    *(undefined2 *)(local_488 + -5) = 0xe183;
    local_488[-6] = (int)local_470 - 0x1f0;
    local_488[-7] = 0x250cb60f;
    local_488 = local_488 + -7;
    local_138[0].func = (ASMFunction)0x7ffd00007fff;
    pcStack_540 = (code *)0x146eab;
    asm_gencall((ASMState *)&local_508[0].field_0,lj_ir_callinfo + 0x21,(IRRef *)local_138);
    RVar16 = (Reg)*(byte *)((long)local_478 + 0x3ffee);
    uVar55 = 1 << (*(byte *)((long)local_478 + 0x3ffee) & 0x1f);
    local_460 = CONCAT44(local_460._4_4_ | uVar55,(uint)local_460 | uVar55);
    *(undefined1 *)((long)local_478 + 0x3ffee) = 0xff;
    uVar55 = local_150.field_1.op12 + 8;
LAB_00146ee2:
    pcStack_540 = (code *)0x146ee9;
    emit_loadi((ASMState *)&local_508[0].field_0,RVar16,uVar55);
    goto switchD_00144850_caseD_c;
  case 'S':
    pcStack_540 = (code *)0x144d4b;
    RVar16 = ra_dest((ASMState *)&local_508[0].field_0,unaff_RBP,0xffef);
    if (((unaff_RBP->field_0).op2 & 1) == 0) {
      pcStack_540 = (code *)0x144d6b;
      RVar18 = ra_scratch((ASMState *)&local_508[0].field_0,~(1 << (RVar16 & 0x1f)) & 0xffef);
      pcStack_540 = (code *)0x144d80;
      emit_storeofs((ASMState *)&local_508[0].field_0,unaff_RBP,RVar18,RVar16,0);
      pcStack_540 = (code *)0x144d96;
      emit_loadofs((ASMState *)&local_508[0].field_0,unaff_RBP,RVar18,RVar16,8);
    }
    else {
      uVar7 = (unaff_RBP->field_0).op1;
      if (((*(char *)((long)local_478 + (ulong)uVar7 * 8 + 6) < '\0') &&
          (pIVar34 = local_478 + uVar7, pIVar34 != unaff_RBP + -1)) &&
         ((pIVar34 != unaff_RBP + -2 ||
          ((-1 < *(char *)((long)unaff_RBP + -2) || (*(char *)((long)unaff_RBP + -1) != '\0')))))) {
        for (; ((pIVar34->field_1).o != 'S' || (((pIVar34->field_0).op2 & 1) != 0));
            pIVar34 = local_478 + (pIVar34->field_0).op1) {
        }
        if (-1 < (short)(pIVar34->field_0).op1) {
          pcStack_540 = (code *)0x146053;
          RVar18 = ra_allocref((ASMState *)&local_508[0].field_0,(uint)uVar7,0xffef);
          uStack_458 = CONCAT44(uStack_458._4_4_,(uint)uStack_458 | 1 << ((byte)RVar18 & 0x1f));
          unaff_RBP = pIVar34;
        }
      }
    }
    pcStack_540 = (code *)0x146076;
    ra_left((ASMState *)&local_508[0].field_0,RVar16,(uint)(unaff_RBP->field_0).op1);
    goto switchD_00144850_caseD_c;
  case 'T':
    uVar55 = (uint)(unaff_RBP->field_0).op1;
    uVar7 = (unaff_RBP->field_0).op2;
    uVar39 = (ulong)uVar7;
    local_138[0].func = (ASMFunction)(ulong)CONCAT24(uVar7,uVar55);
    cVar4 = *(char *)((long)local_478 + uVar39 * 8 + 5);
    if (cVar4 == '\x18') {
      if (*(int *)((ulong)local_478[uVar39].field_1.op12 + 0xc) == 1) {
        local_530 = (IRIns *)CONCAT44(local_530._4_4_,
                                      (int)*(char *)((ulong)local_478[uVar39].field_1.op12 + 0x10));
        local_138[0].func = (ASMFunction)CONCAT44(0x7ffd,uVar55);
        pCVar43 = lj_ir_callinfo + 0x12;
        goto LAB_00146b35;
      }
LAB_00146b2d:
      pCVar43 = lj_ir_callinfo + 0x11;
      local_530 = (IRIns *)CONCAT44(local_530._4_4_,0xffffff7f);
    }
    else {
      if ((uVar7 <= local_40c) || (-1 < *(char *)((long)local_478 + uVar39 * 8 + 6)))
      goto LAB_00146b2d;
      if (cVar4 == 'M') {
        local_530 = (IRIns *)CONCAT44(local_530._4_4_,0xffffff7f);
        local_138[0].func = (ASMFunction)(ulong)CONCAT24(local_478[uVar39].field_0.op1,uVar55);
        local_138[0].flags = (uint32_t)*(ushort *)((long)local_478 + uVar39 * 8 + 2);
        pCVar43 = lj_ir_callinfo + 0x10;
      }
      else {
        if (cVar4 != '[') goto LAB_00146b2d;
        sVar8 = *(short *)((long)local_478 + uVar39 * 8 + 2);
        if (sVar8 == 1) {
          local_530 = (IRIns *)CONCAT44(local_530._4_4_,0xffffff7f);
          local_138[0].func = (ASMFunction)CONCAT44(0x7ffd,uVar55);
          pCVar43 = lj_ir_callinfo + 8;
        }
        else {
          local_530 = (IRIns *)CONCAT44(local_530._4_4_,0xffffff7f);
          local_138[0].func = (ASMFunction)(ulong)CONCAT24(local_478[uVar39].field_0.op1,uVar55);
          pCVar43 = lj_ir_callinfo + 0x12;
          if (sVar8 == 0) {
            pCVar43 = lj_ir_callinfo + 7;
          }
        }
      }
    }
LAB_00146b35:
    pcStack_540 = (code *)0x146b48;
    asm_setupresult((ASMState *)&local_508[0].field_0,unaff_RBP,pCVar43);
    pcStack_540 = (code *)0x146b5e;
    asm_gencall((ASMState *)&local_508[0].field_0,pCVar43,(IRRef *)local_138);
    if (local_138[0].func._4_4_ == 0x7ffd) {
      RVar16 = (Reg)*(byte *)((long)local_478 + 0x3ffee);
      uVar55 = 1 << (*(byte *)((long)local_478 + 0x3ffee) & 0x1f);
      local_460 = CONCAT44(local_460._4_4_ | uVar55,(uint)local_460 | uVar55);
      *(undefined1 *)((long)local_478 + 0x3ffee) = 0xff;
      uVar55 = (uint)local_530;
      if ((uint)local_530 != 0xffffff7f) goto LAB_00146ee2;
      IVar37 = (IRRef)pIVar34[uVar39].field_0.op1;
      goto LAB_00146bad;
    }
    goto switchD_00144850_caseD_c;
  case 'U':
    local_138[0].func =
         (ASMFunction)CONCAT44(local_138[0].func._4_4_,(uint)(unaff_RBP->field_0).op1);
    local_400 = CONCAT44(local_400._4_4_ + 1,(BCReg)local_400);
    pcStack_540 = (code *)0x144ce4;
    asm_setupresult((ASMState *)&local_508[0].field_0,unaff_RBP,lj_ir_callinfo + 0x18);
    pCVar43 = lj_ir_callinfo + 0x18;
LAB_00145800:
    pcStack_540 = (code *)0x145808;
    asm_gencall((ASMState *)&local_508[0].field_0,pCVar43,(IRRef *)local_138);
    goto switchD_00144850_caseD_c;
  case 'V':
    bVar15 = *(byte *)((long)local_478 + (ulong)(unaff_RBP->field_0).op1 * 8 + 6);
    RVar16 = (Reg)bVar15;
    if ((char)bVar15 < '\0') {
      pcStack_540 = (code *)0x1458a7;
      RVar16 = ra_allocref((ASMState *)&local_508[0].field_0,(uint)(unaff_RBP->field_0).op1,0xffef);
    }
    bVar15 = (byte)RVar16 & 0x1f;
    uStack_458 = CONCAT44(uStack_458._4_4_,
                          (uint)uStack_458 & (-2 << bVar15 | 0xfffffffeU >> 0x20 - bVar15));
    pcStack_540 = (code *)0x1458ce;
    RVar18 = ra_scratch((ASMState *)&local_508[0].field_0,~(1 << (RVar16 & 0x1f)) & 0xffef);
    pSVar42 = local_488;
    pcStack_540 = (code *)0x1458ef;
    emit_rmro((ASMState *)&local_508[0].field_0,XO_MOVto,RVar18,RVar16,0xc);
    local_488[-1] = (int)local_470 - 0x1dc;
    *(byte *)((long)local_488 + -5) = 0x25;
    *(byte *)((long)local_488 + -6) = (byte)RVar16 * '\b' & 0x38 | 4;
    *(byte *)((long)local_488 + -7) = 0x89;
    if ((RVar16 & 8) == 0) {
      local_488 = (SnapEntry *)((long)local_488 + -7);
    }
    else {
      *(byte *)(local_488 + -2) = 0x44;
      local_488 = local_488 + -2;
    }
    local_488[-1] = (int)local_470 - 0x1dc;
    *(byte *)((long)local_488 + -5) = 0x25;
    *(byte *)((long)local_488 + -6) = (char)RVar18 * '\b' & 0x38U | 4;
    *(byte *)((long)local_488 + -7) = 0x8b;
    lVar30 = -7;
    if ((RVar18 & 8) != 0) {
      *(byte *)(local_488 + -2) = 0x44;
      lVar30 = -8;
    }
    local_488 = (SnapEntry *)((long)local_488 + lVar30 + -1);
    *(byte *)local_488 = 0xfb;
    pcStack_540 = (code *)0x1463a9;
    emit_rmro((ASMState *)&local_508[0].field_0,XO_ARITHib,4,RVar16,4);
    *(char *)((long)local_488 + -1) = (char)pSVar42 - (char)local_488;
    *(byte *)((long)local_488 + -2) = 0x74;
    *(byte *)((long)local_488 + -3) = 4;
    pcStack_540 = (code *)0x1463e1;
    local_488 = (SnapEntry *)((long)local_488 + -3);
    emit_rmro((ASMState *)&local_508[0].field_0,XO_GROUP3b,0,RVar16,4);
    goto switchD_00144850_caseD_c;
  case 'W':
    pcStack_540 = (code *)0x145b20;
    ra_evictset((ASMState *)&local_508[0].field_0,0xffff0fc7);
    pSVar42 = local_488;
    local_138[0].func = (ASMFunction)(ulong)CONCAT24((unaff_RBP->field_0).op1,0x7ffd);
    pcStack_540 = (code *)0x145b4b;
    asm_gencall((ASMState *)&local_508[0].field_0,lj_ir_callinfo + 0x20,(IRRef *)local_138);
    bVar15 = *(byte *)((long)local_478 + 0x3ffee);
    uVar55 = 1 << (bVar15 & 0x1f);
    local_460 = CONCAT44(local_460._4_4_ | uVar55,(uint)local_460 | uVar55);
    *(undefined1 *)((long)local_478 + 0x3ffee) = 0xff;
    pcStack_540 = (code *)0x145b8b;
    emit_loadi((ASMState *)&local_508[0].field_0,(uint)bVar15,(int)local_470 + -0x248);
    bVar15 = *(byte *)((long)local_478 + (ulong)(unaff_RBP->field_0).op1 * 8 + 6);
    *(char *)((long)local_488 + -1) = (char)pSVar42 - (char)local_488;
    *(byte *)((long)local_488 + -2) = 0x74;
    pbVar32 = (byte *)((long)local_488 + -3);
    *(byte *)((long)local_488 + -3) = 3;
    uVar7 = (unaff_RBP->field_0).op2;
    if ((short)uVar7 < 0) {
      bVar46 = *(byte *)((long)local_478 + (ulong)uVar7 * 8 + 6);
      RVar16 = (Reg)bVar46;
      local_488 = (SnapEntry *)pbVar32;
      if ((char)bVar46 < '\0') {
        pcStack_540 = (code *)0x1467f0;
        RVar16 = ra_allocref((ASMState *)&local_508[0].field_0,(uint)uVar7,
                             ~(1 << (bVar15 & 0x1f)) & 0xfc7);
      }
      bVar46 = (byte)RVar16 & 0x1f;
      uStack_458 = CONCAT44(uStack_458._4_4_,
                            (uint)uStack_458 & (-2 << bVar46 | 0xfffffffeU >> 0x20 - bVar46));
      pcStack_540 = (code *)0x146816;
      emit_rmro((ASMState *)&local_508[0].field_0,XO_GROUP3b,0,RVar16,4);
    }
    else {
      *(IRRef2 *)((long)local_488 + -7) = local_478[uVar7].field_1.op12 + 4;
      *(byte *)(local_488 + -2) = 0x25;
      ((byte *)((long)local_488 + -10))[0] = 0xf6;
      ((byte *)((long)local_488 + -10))[1] = 4;
      local_488 = (SnapEntry *)((long)local_488 + -10);
    }
    *(char *)((long)local_488 + -1) = (char)pSVar42 - (char)local_488;
    *(byte *)((long)local_488 + -2) = 0x74;
    *(byte *)((long)local_488 + -3) = 4;
    xVar44 = XO_GROUP3b;
    RVar18 = 0;
    RVar16 = (Reg)bVar15;
    local_488 = (SnapEntry *)((long)local_488 + -3);
LAB_00146845:
    pcStack_540 = (code *)0x146850;
    emit_rmro((ASMState *)&local_508[0].field_0,xVar44,RVar18,RVar16,-4);
    goto switchD_00144850_caseD_c;
  case 'Y':
    uVar41 = (unaff_RBP->field_0).op2 & 0x1f;
    uVar9 = (ushort)uVar41;
    bVar59 = (ushort)(uVar9 - 0x15) < 2;
    uVar7 = (unaff_RBP->field_0).op1;
    pIVar34 = (IRIns *)(ulong)uVar7;
    bVar15 = (byte)(unaff_RBP->field_0).ot;
    uVar55 = bVar15 & 0x1f;
    if ((byte)((char)uVar55 - 0xdU) < 2) {
      pcStack_540 = (code *)0x145c50;
      local_530 = pIVar34;
      RVar16 = ra_dest((ASMState *)&local_508[0].field_0,unaff_RBP,0xffff0000);
      bVar15 = (byte)RVar16;
      IVar37 = (IRRef)local_530;
      if ((ushort)(uVar9 - 0xd) < 2) {
        pcStack_540 = (code *)0x145c7f;
        RVar18 = asm_fuseload((ASMState *)&local_508[0].field_0,IVar37,0xffff0000);
        xVar44 = (uint)(uVar9 != 0xe) << 8 | XO_CVTSD2SS;
        unaff_RBP = (IRIns *)(ulong)xVar44;
        pcStack_540 = (code *)0x145c99;
        emit_mrm((ASMState *)&local_508[0].field_0,xVar44,RVar16,RVar18);
        if (RVar18 == RVar16) goto switchD_00144850_caseD_c;
      }
      else {
        uVar55 = (uint)(uVar41 == 9 || bVar59);
        if ((uVar41 | 2) == 0x16) {
          bVar46 = *(byte *)((long)local_478 + (long)local_530 * 8 + 6);
          RVar18 = (Reg)bVar46;
          if ((char)bVar46 < '\0') {
            pcStack_540 = (code *)0x146ab9;
            RVar18 = ra_allocref((ASMState *)&local_508[0].field_0,IVar37,0xffef);
          }
          bVar46 = (byte)RVar18 & 0x1f;
          uStack_458 = CONCAT44(uStack_458._4_4_,
                                (uint)uStack_458 & (-2 << bVar46 | 0xfffffffeU >> 0x20 - bVar46));
        }
        else {
          pcStack_540 = (code *)0x147156;
          RVar18 = asm_fuseloadm((ASMState *)&local_508[0].field_0,IVar37,0xffef,uVar55);
        }
        if (uVar9 == 0x16) {
          local_488[-1] = (int)local_470 + 0x120;
          *(byte *)((long)local_488 + -5) = 0x25;
          *(byte *)((long)local_488 + -6) = bVar15 * '\b' & 0x38 | 4;
          pbVar32 = (byte *)((long)local_488 + -10);
          pbVar32[0] = 0xfc;
          pbVar32[1] = 0xf2;
          pbVar32[2] = 0xf;
          pbVar32[3] = 0x58;
          pbVar32 = (byte *)((long)local_488 + -9);
          if ((RVar16 & 8) != 0) {
            *pbVar32 = 0x44;
            pbVar32 = (byte *)((long)local_488 + -10);
            *pbVar32 = 0xf2;
          }
          pbVar32[-1] = (char)local_488 - (char)pbVar32;
          pbVar32[-2] = 0x79;
          pbVar32[-3] = ((byte)RVar18 & 7) + (byte)RVar18 * '\b' | 0xc0;
          pbVar32[-4] = 0x85;
          pbVar32[-5] = (byte)(RVar18 >> 0x10) | (byte)(RVar18 >> 1) & 4 | (byte)(RVar18 >> 3) & 1 |
                        0x48;
          local_488 = (SnapEntry *)(pbVar32 + -5);
        }
        if (uVar41 == 9 || bVar59) {
          uVar55 = 0x80200;
        }
        if (uVar9 == 0x14) {
          uVar55 = 0x80200;
        }
        pcStack_540 = (code *)0x14723c;
        emit_mrm((ASMState *)&local_508[0].field_0,
                 (uint)(((unaff_RBP->field_1).t.irt & 0x1f) != 0xe) << 8 | XO_CVTSI2SD,
                 uVar55 | RVar16,RVar18);
      }
      *(byte *)((long)local_488 + -1) = (bVar15 & 7) + bVar15 * '\b' | 0xc0;
      ((byte *)((long)local_488 + -3))[0] = 0xf;
      ((byte *)((long)local_488 + -3))[1] = 0x57;
      uVar55 = RVar16 >> 3 & 1 | RVar16 >> 1 & 4;
      if (uVar55 == 0) {
        local_488 = (SnapEntry *)((long)local_488 + -3);
      }
      else {
        *(byte *)(local_488 + -1) = (byte)uVar55 | 0x40;
        local_488 = local_488 + -1;
      }
LAB_001475aa:
      goto switchD_00144850_caseD_c;
    }
    if ((ushort)(uVar9 - 0xd) < 2) {
      if ((char)bVar15 < '\0') {
        bVar15 = *(byte *)((long)local_478 + (long)pIVar34 * 8 + 6);
        RVar16 = (Reg)bVar15;
        if ((char)bVar15 < '\0') {
          pcStack_540 = (code *)0x1470d0;
          RVar16 = ra_allocref((ASMState *)&local_508[0].field_0,(uint)uVar7,0xffff0000);
        }
        bVar15 = (byte)RVar16 & 0x1f;
        uStack_458 = CONCAT44(uStack_458._4_4_,
                              (uint)uStack_458 & (-2 << bVar15 | 0xfffffffeU >> 0x20 - bVar15));
        pcStack_540 = (code *)0x1470ee;
        asm_tointg((ASMState *)&local_508[0].field_0,unaff_RBP,RVar16);
        goto switchD_00144850_caseD_c;
      }
      pcStack_540 = (code *)0x146503;
      RVar16 = ra_dest((ASMState *)&local_508[0].field_0,unaff_RBP,0xffef);
      xVar44 = (uint)(uVar9 != 0xe) << 8 | XO_CVTTSD2SI;
      bVar46 = (unaff_RBP->field_1).t.irt & 0x1f;
      bVar15 = (byte)RVar16;
      if (bVar46 == 0x14) {
        *(byte *)((long)local_488 + -1) = (bVar15 & 7) + bVar15 * '\b' | 0xc0;
        *(byte *)((long)local_488 + -2) = 0x8b;
        uVar55 = RVar16 >> 3 & 1 | RVar16 >> 1 & 4;
        if (uVar55 == 0) {
          local_488 = (SnapEntry *)((long)local_488 + -2);
        }
        else {
          *(byte *)((long)local_488 + -3) = (byte)uVar55 | 0x40;
          local_488 = (SnapEntry *)((long)local_488 + -3);
        }
      }
      else if (bVar46 == 0x16) {
        if (*(char *)((long)local_478 + (long)pIVar34 * 8 + 6) < '\0') {
          bVar46 = *(byte *)((long)local_478 + (long)pIVar34 * 8 + 6);
          RVar18 = (Reg)bVar46;
          if ((char)bVar46 < '\0') {
            pcStack_540 = (code *)0x147895;
            RVar18 = ra_allocref((ASMState *)&local_508[0].field_0,(uint)uVar7,0xffff0000);
          }
          bVar46 = (byte)RVar18 & 0x1f;
          uStack_458 = CONCAT44(uStack_458._4_4_,
                                (uint)uStack_458 & (-2 << bVar46 | 0xfffffffeU >> 0x20 - bVar46));
        }
        else {
          pcStack_540 = (code *)0x14654e;
          RVar18 = ra_scratch((ASMState *)&local_508[0].field_0,0xffff0000);
        }
        local_520 = local_488;
        local_530 = (IRIns *)(CONCAT44(local_530._4_4_,RVar16) | 0x80200);
        pcStack_540 = (code *)0x1478d1;
        emit_rr((ASMState *)&local_508[0].field_0,xVar44,RVar16 | 0x80200,RVar18);
        bVar46 = (char)RVar18 * '\b' & 0x38U | 4;
        if (uVar9 == 0xe) {
          local_488[-1] = (int)local_470 + 0x128;
          *(byte *)((long)local_488 + -5) = 0x25;
          *(byte *)((long)local_488 + -6) = bVar46;
          pbVar32 = (byte *)((long)local_488 + -10);
          pbVar32[0] = 0xfc;
          pbVar32[1] = 0xf2;
          pbVar32[2] = 0xf;
          pbVar32[3] = 0x58;
          bVar46 = 0xf2;
        }
        else {
          local_488[-1] = (int)local_470 + 0x130;
          *(byte *)((long)local_488 + -5) = 0x25;
          *(byte *)((long)local_488 + -6) = bVar46;
          pbVar32 = (byte *)((long)local_488 + -10);
          pbVar32[0] = 0xfc;
          pbVar32[1] = 0xf3;
          pbVar32[2] = 0xf;
          pbVar32[3] = 0x58;
          bVar46 = 0xf3;
        }
        pbVar32 = (byte *)((long)local_488 + -9);
        if ((RVar18 & 8) != 0) {
          pbVar32 = (byte *)((long)local_488 + -10);
          *(byte *)((long)local_488 + -9) = 0x44;
          *pbVar32 = bVar46;
        }
        unaff_RBP = local_508;
        pbVar32[-1] = (char)local_520 - (char)pbVar32;
        pbVar32[-2] = 0x79;
        pbVar32[-3] = (bVar15 & 7) + bVar15 * '\b' | 0xc0;
        pbVar32[-4] = 0x85;
        pbVar32[-5] = (byte)(RVar16 >> 3) & 1 | (byte)(RVar16 >> 1) & 4 | 0x48;
        local_488 = (SnapEntry *)(pbVar32 + -5);
        pcStack_540 = (code *)0x1479af;
        emit_rr((ASMState *)&unaff_RBP->field_0,xVar44,(uint)local_530,RVar18);
        goto LAB_001479b4;
      }
      uVar55._0_2_ = *(IROpT *)((long)unaff_RBP + 4);
      uVar55._2_2_ = *(IRRef1 *)((long)unaff_RBP + 6);
      uVar41 = 0;
      if (((byte)(undefined2)uVar55 & 0x1f) == 0x14) {
        uVar41 = 0x80200;
      }
      if ((0x604208U >> (uVar55 & 0x1f) & 1) != 0) {
        uVar41 = 0x80200;
      }
      RVar18 = uVar41 | RVar16;
      unaff_RBP = (IRIns *)(ulong)RVar18;
      pcStack_540 = (code *)0x147a04;
      RVar16 = asm_fuseload((ASMState *)&local_508[0].field_0,(uint)uVar7,0xffff0000);
    }
    else if ((ushort)(uVar9 - 0xf) < 4) {
      pcStack_540 = (code *)0x146af5;
      RVar18 = ra_dest((ASMState *)&local_508[0].field_0,unaff_RBP,0xffef);
      if (uVar9 == 0x11) {
        unaff_RBP = (IRIns *)0xbf0f00fd;
      }
      else if (uVar41 == 0x10) {
        RVar18 = RVar18 | 0x200;
        unaff_RBP = (IRIns *)0xb60f00fd;
      }
      else if (uVar41 == 0xf) {
        RVar18 = RVar18 | 0x200;
        unaff_RBP = (IRIns *)0xbe0f00fd;
      }
      else {
        unaff_RBP = (IRIns *)0xb70f00fd;
      }
      xVar44 = (x86Op)unaff_RBP;
      pcStack_540 = (code *)0x14778a;
      RVar16 = asm_fuseload((ASMState *)&local_508[0].field_0,(uint)uVar7,0xffef);
    }
    else {
      pcStack_540 = (code *)0x146f93;
      RVar18 = ra_dest((ASMState *)&local_508[0].field_0,unaff_RBP,0xffef);
      if ((0x604208U >> uVar55 & 1) != 0) {
        if (((0x16 < uVar9) || ((0x600200U >> uVar41 & 1) == 0)) &&
           (((unaff_RBP->field_0).op2 & 0x800) != 0)) {
          pcStack_540 = (code *)0x147a30;
          RVar16 = asm_fuseload((ASMState *)&local_508[0].field_0,(uint)uVar7,0xffef);
          RVar18 = RVar18 | 0x80200;
          xVar44 = XO_MOVSXd;
          goto LAB_00144e65;
        }
LAB_001479b4:
        pcStack_540 = (code *)0x1479bc;
        ra_left((ASMState *)&local_508[0].field_0,RVar18,(uint)uVar7);
        goto switchD_00144850_caseD_c;
      }
      if ((0x16 < uVar9) || ((0x600200U >> uVar41 & 1) == 0)) goto LAB_001479b4;
      pcStack_540 = (code *)0x146fd3;
      RVar16 = asm_fuseload((ASMState *)&local_508[0].field_0,(uint)uVar7,0xffef);
      xVar44 = XO_MOV;
    }
LAB_00144e65:
    pcStack_540 = (code *)0x144e6c;
    emit_mrm((ASMState *)&local_508[0].field_0,xVar44,RVar18,RVar16);
    goto switchD_00144850_caseD_c;
  case 'Z':
    pcStack_540 = (code *)0x144d04;
    RVar16 = ra_dest((ASMState *)&local_508[0].field_0,unaff_RBP,0xffef);
    if (*(char *)((long)local_478 + (ulong)(unaff_RBP->field_0).op1 * 8 + 6) < '\0') {
      pcStack_540 = (code *)0x14665f;
      uVar55 = ra_allocref((ASMState *)&local_508[0].field_0,(uint)(unaff_RBP->field_0).op1,
                           0xffff0000);
      bVar15 = (byte)uVar55 & 0x1f;
      uStack_458 = CONCAT44(uStack_458._4_4_,
                            (uint)uStack_458 & (-2 << bVar15 | 0xfffffffeU >> 0x20 - bVar15));
    }
    else {
      pcStack_540 = (code *)0x144d2c;
      uVar55 = ra_scratch((ASMState *)&local_508[0].field_0,0xffff0000);
    }
    *(byte *)((long)local_488 + -1) = ((byte)RVar16 & 7) + (char)uVar55 * '\b' | 0xc0;
    pbVar32 = (byte *)((long)local_488 + -5);
    pbVar32[0] = 0xfc;
    pbVar32[1] = 0x66;
    pbVar32[2] = 0xf;
    pbVar32[3] = 0x7e;
    uVar41 = RVar16 >> 3 & 1 | uVar55 >> 1 & 4;
    if (uVar41 == 0) {
      local_488 = local_488 + -1;
    }
    else {
      *(byte *)(local_488 + -1) = (byte)uVar41 | 0x40;
      *(byte *)((long)local_488 + -5) = 0x66;
      local_488 = (SnapEntry *)((long)local_488 + -5);
    }
    pcStack_540 = (code *)0x1466d9;
    RVar16 = asm_fuseload((ASMState *)&local_508[0].field_0,(uint)(unaff_RBP->field_0).op2,
                          ~(1 << (uVar55 & 0x1f)) & 0xffff0000);
    pcStack_540 = (code *)0x1466ea;
    emit_mrm((ASMState *)&local_508[0].field_0,XO_ADDSD,uVar55,RVar16);
    pcStack_540 = (code *)0x1466f8;
    ra_left((ASMState *)&local_508[0].field_0,uVar55,(uint)(unaff_RBP->field_0).op1);
    goto switchD_00144850_caseD_c;
  case '[':
    pcStack_540 = (code *)0x14522a;
    asm_snap_prep((ASMState *)&local_508[0].field_0);
    local_400 = CONCAT44(local_400._4_4_ + 1,(BCReg)local_400);
    if ((unaff_RBP->field_0).op2 == 1) {
      local_138[0].func = (ASMFunction)0x7ffd00007fff;
      pCVar43 = lj_ir_callinfo + 5;
    }
    else {
      local_138[0].func = (ASMFunction)(ulong)CONCAT24((unaff_RBP->field_0).op1,0x7fff);
      pCVar43 = lj_ir_callinfo + (ulong)((unaff_RBP->field_0).op2 != 0) * 2 + 4;
    }
    pcStack_540 = (code *)0x146191;
    asm_setupresult((ASMState *)&local_508[0].field_0,unaff_RBP,pCVar43);
    pcStack_540 = (code *)0x1461a4;
    asm_gencall((ASMState *)&local_508[0].field_0,pCVar43,(IRRef *)local_138);
    if ((unaff_RBP->field_0).op2 == 1) {
      RVar16 = (Reg)*(byte *)((long)local_478 + 0x3ffee);
      uVar55 = 1 << (*(byte *)((long)local_478 + 0x3ffee) & 0x1f);
      local_460 = CONCAT44(local_460._4_4_ | uVar55,(uint)local_460 | uVar55);
      *(undefined1 *)((long)local_478 + 0x3ffee) = 0xff;
      IVar37 = (IRRef)(unaff_RBP->field_0).op1;
LAB_00146bad:
      pcStack_540 = (code *)0x146bb4;
      asm_tvptr((ASMState *)&local_508[0].field_0,RVar16,IVar37);
    }
    goto switchD_00144850_caseD_c;
  case '\\':
    pcStack_540 = (code *)0x144bca;
    ra_evictset((ASMState *)&local_508[0].field_0,0xffff0fc7);
    pcStack_540 = (code *)0x144bd7;
    asm_guardcc((ASMState *)&local_508[0].field_0,4);
    ((byte *)((long)local_488 + -2))[0] = 0x85;
    ((byte *)((long)local_488 + -2))[1] = 0xc0;
    local_488 = (SnapEntry *)((long)local_488 + -2);
    local_138[0].func = (ASMFunction)CONCAT44(0x7ffd,(uint)(unaff_RBP->field_0).op1);
    pcStack_540 = (code *)0x144c13;
    asm_gencall((ASMState *)&local_508[0].field_0,lj_ir_callinfo + 3,(IRRef *)local_138);
    bVar15 = *(byte *)((long)local_478 + 0x3ffee);
    uVar55 = 1 << (bVar15 & 0x1f);
    local_460 = CONCAT44(local_460._4_4_ | uVar55,(uint)local_460 | uVar55);
    *(undefined1 *)((long)local_478 + 0x3ffee) = 0xff;
    pcStack_540 = (code *)0x144c5e;
    emit_rmro((ASMState *)&local_508[0].field_0,XO_LEA,bVar15 | 0x80200,4,
              (uint)(unaff_RBP->field_1).s << 2);
    goto switchD_00144850_caseD_c;
  case ']':
  case '_':
  case '`':
    goto switchD_00144850_caseD_5d;
  case '^':
    local_400 = CONCAT44(local_400._4_4_ + 1,(BCReg)local_400);
switchD_00144850_caseD_5d:
    pCVar43 = lj_ir_callinfo + (unaff_RBP->field_0).op2;
    pcStack_540 = (code *)0x144fc7;
    asm_collectargs((ASMState *)&local_508[0].field_0,unaff_RBP,pCVar43,(IRRef *)local_138);
    pcStack_540 = (code *)0x144fd5;
    asm_setupresult((ASMState *)&local_508[0].field_0,unaff_RBP,pCVar43);
    pcStack_540 = (code *)0x144fe3;
    asm_gencall((ASMState *)&local_508[0].field_0,pCVar43,(IRRef *)local_138);
    goto switchD_00144850_caseD_c;
  case 'a':
    pcStack_540 = (code *)0x144f05;
    local_148 = asm_callx_flags((ASMState *)&local_508[0].field_0,unaff_RBP);
    pcStack_540 = (code *)0x144f27;
    asm_collectargs((ASMState *)&local_508[0].field_0,unaff_RBP,(CCallInfo *)&local_150.field_0,
                    (IRRef *)local_138);
    pcStack_540 = (code *)0x144f35;
    asm_setupresult((ASMState *)&local_508[0].field_0,unaff_RBP,(CCallInfo *)&local_150.field_0);
    uVar39 = (ulong)(unaff_RBP->field_0).op2;
    pIVar34 = local_478 + uVar39;
    if ((pIVar34->field_1).o == 'b') {
      uVar39 = (ulong)(pIVar34->field_0).op1;
      pIVar34 = local_478 + uVar39;
    }
    if ((short)uVar39 < 0) {
LAB_001468dc:
      local_150 = (IRIns)0x0;
    }
    else {
      if ((pIVar34->field_1).o == '\x1d') {
        local_150 = pIVar34[1];
      }
      else {
        local_150._4_4_ = 0;
        local_150.field_1.op12 = (pIVar34->field_1).op12;
      }
      if ((long)(int)((long)local_150 - (long)local_488) != (long)local_150 - (long)local_488)
      goto LAB_001468dc;
    }
    if (local_150 == (IRIns)0x0) {
      bVar15 = *(byte *)((long)local_478 + uVar39 * 8 + 6);
      RVar16 = (Reg)bVar15;
      if ((char)bVar15 < '\0') {
        pcStack_540 = (code *)0x14690c;
        RVar16 = ra_allocref((ASMState *)&local_508[0].field_0,(IRRef)uVar39,0xf028);
      }
      bVar15 = (byte)RVar16 & 0x1f;
      uStack_458 = CONCAT44(uStack_458._4_4_,
                            (uint)uStack_458 & (-2 << bVar15 | 0xfffffffeU >> 0x20 - bVar15));
      *(byte *)((long)local_488 + -1) = (byte)RVar16 & 7 | 0xd0;
      *(byte *)((long)local_488 + -2) = 0xff;
      if ((RVar16 & 8) == 0) {
        local_488 = (SnapEntry *)((long)local_488 + -2);
      }
      else {
        *(byte *)((long)local_488 + -3) = 0x41;
        local_488 = (SnapEntry *)((long)local_488 + -3);
      }
    }
    pcStack_540 = (code *)0x146c1f;
    asm_gencall((ASMState *)&local_508[0].field_0,(CCallInfo *)&local_150.field_0,(IRRef *)local_138
               );
    goto switchD_00144850_caseD_c;
  }
  pcStack_540 = (code *)0x1469d6;
  emit_mrm((ASMState *)&local_508[0].field_0,xVar44,RVar16,0x20);
  goto switchD_00144850_caseD_c;
LAB_00147b52:
  if ((local_3b8 == (SnapEntry *)0x0) ||
     (J = local_160, local_160->curfinal->nins < local_158->nins)) {
    if (local_488 < local_480) {
LAB_0014869c:
      pcStack_540 = (code *)0x1486a6;
      asm_mclimit((ASMState *)&local_508[0].field_0);
    }
    if (0 < local_400._4_4_) {
      local_440 = (uint)local_3f8->snap->ref;
      pcStack_540 = (code *)0x147bc1;
      asm_snap_prep((ASMState *)&local_508[0].field_0);
      pcStack_540 = (code *)0x147bc9;
      asm_gc_check((ASMState *)&local_508[0].field_0);
      local_440 = local_43c;
    }
    if ((uint)local_460 < 0xffff0000) {
      uVar55 = ~(uint)local_460 & 0xffff0000;
      do {
        uVar41 = 0;
        if (uVar55 != 0) {
          for (; (uVar55 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
          }
        }
        uVar57 = (uint)*(ushort *)((long)local_508 + (ulong)uVar41 * 4);
        if (uVar57 < 0x8000) {
          pcStack_540 = (code *)0x147c08;
          ra_rematk((ASMState *)&local_508[0].field_0,uVar57);
          if (local_488 < local_480) goto LAB_0014869c;
        }
        bVar15 = (byte)uVar41 & 0x1f;
        uVar55 = uVar55 & (-2 << bVar15 | 0xfffffffeU >> 0x20 - bVar15);
      } while (uVar55 != 0);
    }
    if (((uint)local_460 & 0xffef) != 0xffef) {
      uVar55 = (uint)local_460 & 0xffef ^ 0xffef;
      do {
        uVar41 = 0;
        if (uVar55 != 0) {
          for (; (uVar55 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
          }
        }
        uVar57 = (uint)*(ushort *)((long)local_508 + (ulong)uVar41 * 4);
        if (uVar57 < 0x8000) {
          pcStack_540 = (code *)0x147c5d;
          ra_rematk((ASMState *)&local_508[0].field_0,uVar57);
          if (local_488 < local_480) goto LAB_0014869c;
        }
        bVar15 = (byte)uVar41 & 0x1f;
        uVar55 = uVar55 & (-2 << bVar15 | 0xfffffffeU >> 0x20 - bVar15);
      } while (uVar55 != 0);
    }
    if (local_3f0 != (GCtrace *)0x0) {
      local_178 = local_3f0->ir;
      if ((local_42c != 0) && (local_3f0->topslot < (BCReg)local_400)) {
        pcStack_540 = (code *)0x147cc0;
        asm_snap_alloc((ASMState *)&local_508[0].field_0,0);
      }
      bVar15 = *(byte *)((long)local_478 + 0x40006);
      uVar55 = 0x80;
      if (-1 < (char)bVar15) {
        uVar55 = (uint)bVar15;
        uVar41 = (uint)local_460 | 1 << (uVar55 & 0x1f);
        local_460 = CONCAT44(local_460._4_4_,uVar41);
        if (((local_460._4_4_ >> (uVar55 & 0x1f) & 1) != 0) ||
           ((*(byte *)((long)local_478 + 0x40004) & 0x20) != 0)) {
          *(undefined1 *)((long)local_478 + 0x40006) = 0xff;
        }
        bVar46 = *(byte *)((long)local_178 + 0x40006);
        if (bVar46 != bVar15) {
          if (((char)bVar46 < '\0') || ((uVar41 >> (bVar46 & 0x1f) & 1) == 0)) {
            local_488[-1] = (int)local_470 - 0xb8;
            *(byte *)((long)local_488 + -5) = 0x25;
            *(byte *)((long)local_488 + -6) = bVar15 * '\b' & 0x38 | 4;
            *(byte *)((long)local_488 + -7) = 0x8b;
            if ((bVar15 & 8) == 0) {
              local_488 = (SnapEntry *)((long)local_488 + -7);
            }
            else {
              *(byte *)(local_488 + -2) = 0x44;
              local_488 = local_488 + -2;
            }
            uVar55 = 0x80;
          }
          else {
            *(byte *)((long)local_488 + -1) = bVar46 & 7 | bVar15 * '\b' | 0xc0;
            *(byte *)((long)local_488 + -2) = 0x8b;
            bVar15 = bVar46 >> 3 & 1 | bVar15 >> 1 & 4;
            if (bVar15 == 0) {
              local_488 = (SnapEntry *)((long)local_488 + -2);
            }
            else {
              *(byte *)((long)local_488 + -3) = bVar15 | 0x40;
              local_488 = (SnapEntry *)((long)local_488 + -3);
            }
            uVar55 = (uint)*(byte *)((long)local_178 + 0x40006);
          }
        }
      }
      bVar15 = (byte)uVar55 & 0x1f;
      uVar57 = -2 << bVar15 | 0xfffffffeU >> 0x20 - bVar15;
      uVar41 = uVar57 & 0xffef;
      if (uVar55 == 0x80) {
        uVar41 = 0xffef;
      }
      if (uVar55 == 0x80) {
        uVar57 = 0xffffffef;
      }
      uVar39 = (ulong)local_43c;
      if (uVar39 < 0x8001) {
        local_524 = 0;
        bVar59 = true;
        local_520 = (SnapEntry *)((ulong)local_520._4_4_ << 0x20);
      }
      else {
        local_530 = (IRIns *)CONCAT44(local_530._4_4_,uVar57);
        puVar31 = auStack_10372 + uVar39;
        lVar30 = uVar39 << 3;
        local_520 = (SnapEntry *)((ulong)local_520._4_4_ << 0x20);
        local_518 = (IRIns *)((ulong)local_518 & 0xffffffff00000000);
        local_524 = 0;
        do {
          pIVar34 = local_478;
          pIVar22 = (IRIns *)((long)local_478 + lVar30);
          uVar7 = *puVar31;
          bVar15 = *(byte *)((long)local_478 + lVar30 + 6);
          if ((char)bVar15 < '\0') {
            if (*(char *)((long)local_478 + lVar30 + 7) != '\0') {
              pbVar32 = (byte *)((long)local_478 + lVar30 + 4);
              *pbVar32 = *pbVar32 | 0x20;
              local_518 = (IRIns *)CONCAT44(local_518._4_4_,1);
            }
          }
          else {
            local_530 = (IRIns *)CONCAT44(local_530._4_4_,(uint)local_530 & ~(1 << (bVar15 & 0x1f)))
            ;
            bVar46 = *(byte *)((long)local_478 + lVar30 + 7);
            if (bVar46 != 0) {
              local_510 = (SnapEntry *)CONCAT44(local_510._4_4_,uVar41);
              pcStack_540 = (code *)0x14807c;
              emit_storeofs((ASMState *)&local_508[0].field_0,pIVar22,(uint)bVar15,4,
                            (uint)bVar46 << 2);
              uVar41 = (uint)local_510;
              if (local_488 < local_480) goto LAB_0014869c;
            }
          }
          bVar15 = (pIVar22->field_1).r;
          if (bVar15 == uVar7) {
            local_460 = CONCAT44(local_460._4_4_,(uint)local_460 | 1 << (bVar15 & 0x1f));
          }
          else if (uVar7 < 0x100) {
            if ((-1 < (char)bVar15) || (*(char *)((long)pIVar34 + lVar30 + 7) != '\0')) {
              *(short *)((long)&local_138[0].func + (ulong)uVar7 * 2) = (short)uVar39;
              local_520 = (SnapEntry *)
                          CONCAT44(local_520._4_4_,(uint)local_520 | 1 << (uVar7 & 0x1f));
            }
          }
          else if (-1 < (char)bVar15) {
            local_524 = 1;
          }
          bVar15 = (byte)uVar7 & 0x1f;
          uVar55 = -2 << bVar15 | 0xfffffffeU >> 0x20 - bVar15;
          if (0xff < uVar7) {
            uVar55 = 0xffffffff;
          }
          uVar41 = uVar41 & uVar55;
          uVar55 = (int)uVar39 - 1;
          uVar39 = (ulong)uVar55;
          puVar31 = puVar31 + -1;
          lVar30 = lVar30 + -8;
        } while (0x8000 < uVar55);
        bVar59 = (int)local_518 == 0;
        uVar57 = (uint)local_530;
      }
      local_510 = (SnapEntry *)CONCAT44(local_510._4_4_,uVar41);
      uVar55 = local_448 * 4 - 4 & 0xfffffff0;
      if ((int)local_448 < 5) {
        uVar55 = 0;
      }
      local_16c = uVar55 - local_3f0->spadjust;
      local_168 = 0;
      if (0 < (int)local_16c) {
        local_168 = (ulong)local_16c;
      }
      if ((int)local_16c < 0) {
        uVar55 = (uint)local_3f0->spadjust;
      }
      local_3f8->spadjust = (uint16_t)uVar55;
      uVar55 = (uint)local_520;
      if ((!bVar59) && (uVar39 = (ulong)local_43c, 0x8000 < uVar39)) {
        puVar31 = auStack_10372 + uVar39;
        lVar30 = uVar39 << 3;
        do {
          pIVar34 = local_478;
          bVar15 = *(byte *)((long)local_478 + lVar30 + 4);
          if ((bVar15 & 0x20) != 0) {
            *(byte *)((long)local_478 + lVar30 + 4) = bVar15 & 0xdf;
            uVar7 = *puVar31;
            if (uVar7 < 0x100) {
              *(byte *)((long)local_478 + lVar30 + 6) = (byte)uVar7 | 0x80;
            }
            else if ((int)local_168 + (uint)(uVar7 >> 8) * 4 ==
                     (uint)*(byte *)((long)local_478 + lVar30 + 7) << 2) goto LAB_00148309;
            uVar41 = 0xffff0000;
            if (1 < (byte)((*(byte *)((long)local_478 + lVar30 + 4) & 0x1f) - 0xd)) {
              uVar41 = 0xffef;
            }
            local_520 = (SnapEntry *)CONCAT44(local_520._4_4_,uVar55);
            local_530 = (IRIns *)CONCAT44(local_530._4_4_,uVar57);
            if ((uVar41 & uVar57) == 0) goto LAB_00148876;
            local_518 = (IRIns *)((long)local_478 + lVar30);
            pcStack_540 = (code *)0x148285;
            RVar16 = ra_allocref((ASMState *)&local_508[0].field_0,(IRRef)uVar39,uVar41 & uVar57);
            pcStack_540 = (code *)0x1482a8;
            emit_storeofs((ASMState *)&local_508[0].field_0,local_518,RVar16,4,
                          (uint)*(byte *)((long)pIVar34 + lVar30 + 7) << 2);
            bVar15 = (byte)RVar16 & 0x1f;
            if (RVar16 == uVar7) {
              local_460 = CONCAT44(local_460._4_4_,(uint)local_460 | 1 << ((byte)RVar16 & 0x1f));
              uVar55 = (uint)local_520 & (-2 << bVar15 | 0xfffffffeU >> 0x20 - bVar15);
            }
            else {
              uVar55 = (uint)local_520;
              if (0xff < uVar7) {
                local_524 = 1;
              }
            }
            if (local_488 < local_480) goto LAB_0014869c;
            uVar57 = (uint)local_530 & ~(1 << (RVar16 & 0x1f));
          }
LAB_00148309:
          uVar41 = (IRRef)uVar39 - 1;
          uVar39 = (ulong)uVar41;
          puVar31 = puVar31 + -1;
          lVar30 = lVar30 + -8;
        } while (0x8000 < uVar41);
      }
      pSVar42 = local_488;
      local_488[-1] = (uint)local_3f8->traceno;
      local_488[-2] = (int)local_470 - 0xe8;
      *(byte *)((long)local_488 + -9) = 0x25;
      ((byte *)((long)local_488 + -0xb))[0] = 199;
      ((byte *)((long)local_488 + -0xb))[1] = 4;
      local_488 = (SnapEntry *)((long)local_488 + -0xb);
      if (0 < (int)local_16c) {
        if ((int)local_16c < 0x81) {
          *(byte *)(pSVar42 + -3) = (byte)-(int)local_168;
          pSVar42 = pSVar42 + -3;
          uVar28 = 0x830000fe;
        }
        else {
          *(int *)((long)pSVar42 + -0xf) = -(int)local_168;
          pSVar42 = (SnapEntry *)((long)pSVar42 + -0xf);
          uVar28 = 0x810000fe;
        }
        *(byte *)((long)pSVar42 + -1) = 0xc4;
        *(undefined4 *)((long)pSVar42 + -5) = uVar28;
        *(byte *)((long)pSVar42 + -3) = 0x48;
        local_488 = (SnapEntry *)((long)pSVar42 + -3);
      }
      if (local_524 != 0) {
        if (((uint)local_460 & 0xffffffef) != 0xffffffef) {
          uVar41 = (uint)local_460 & 0xffffffef ^ 0xffffffef;
          do {
            uVar53 = 0;
            if (uVar41 != 0) {
              for (; (uVar41 >> uVar53 & 1) == 0; uVar53 = uVar53 + 1) {
              }
            }
            uVar7 = *(ushort *)((long)local_508 + (ulong)uVar53 * 4);
            if (0xff < local_370[uVar7 - 0x8001]) {
              local_460 = CONCAT44(local_460._4_4_,(uint)local_460 | 1 << ((byte)uVar53 & 0x1f));
              pcStack_540 = (code *)0x14842d;
              emit_loadofs((ASMState *)&local_508[0].field_0,local_478 + uVar7,uVar53,4,
                           local_370[uVar7 - 0x8001] >> 6 & 0xfffffffc);
              if (local_488 < local_480) goto LAB_0014869c;
            }
            uVar41 = uVar41 & ~(1 << (uVar53 & 0x1f));
          } while (uVar41 != 0);
        }
      }
      local_178 = local_178 + 0x8000;
      do {
        uVar41 = uVar55 & 0xffef;
        local_530 = (IRIns *)CONCAT44(local_530._4_4_,uVar57);
        iVar27 = 0;
        if ((uVar55 & 0xffef) != 0) {
          for (; (uVar41 >> iVar27 & 1) == 0; iVar27 = iVar27 + 1) {
          }
        }
        local_520 = (SnapEntry *)CONCAT44(local_520._4_4_,iVar27);
        uVar53 = uVar55 & 0xffff0000;
        RVar16 = 0;
        if ((uVar55 & 0xffff0000) != 0) {
          for (; (uVar53 >> RVar16 & 1) == 0; RVar16 = RVar16 + 1) {
          }
        }
        while( true ) {
          uVar29 = (uint)local_460 & uVar55;
          if (uVar29 != 0) break;
          if (uVar55 == 0) {
            bVar15 = local_3f0->topslot;
            local_3f8->topslot = bVar15;
            if (bVar15 < (BCReg)local_400) {
              exitno = local_470->exitno;
              local_3f8->topslot = (uint8_t)local_400;
              pcStack_540 = (code *)0x1485ab;
              asm_stack_check((ASMState *)&local_508[0].field_0,(BCReg)local_400,local_178,
                              (uint)local_510,exitno);
            }
            goto LAB_001485ab;
          }
          if (uVar41 != 0) {
            uVar29 = (uint)local_460 & (uVar41 ^ 0xffef) & uVar57;
            if (uVar29 == 0) goto LAB_00148876;
            RVar18 = 0;
            if (uVar29 != 0) {
              for (; (uVar29 >> RVar18 & 1) == 0; RVar18 = RVar18 + 1) {
              }
            }
            pcStack_540 = (code *)0x1484c1;
            ra_rename((ASMState *)&local_508[0].field_0,(uint)local_520,RVar18);
          }
          if (uVar53 != 0) {
            uVar29 = (uint)local_460 & (uVar53 ^ 0xffff0000) & (uint)local_530;
            if (uVar29 == 0) goto LAB_00148876;
            RVar18 = 0;
            if (uVar29 != 0) {
              for (; (uVar29 >> RVar18 & 1) == 0; RVar18 = RVar18 + 1) {
              }
            }
            pcStack_540 = (code *)0x1484ec;
            ra_rename((ASMState *)&local_508[0].field_0,RVar16,RVar18);
          }
          if (local_488 < local_480) goto LAB_0014869c;
        }
        uVar41 = 0;
        if (uVar29 != 0) {
          for (; (uVar29 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
          }
        }
        pIVar34 = local_478 + *(ushort *)((long)&local_138[0].func + (ulong)uVar41 * 2);
        uVar55 = uVar55 & ~(1 << (uVar41 & 0x1f));
        uVar57 = (uint)local_530 & ~(1 << (uVar41 & 0x1f));
        local_460 = CONCAT44(local_460._4_4_,(uint)local_460 | 1 << ((pIVar34->field_1).r & 0x1f));
        pcStack_540 = (code *)0x148545;
        emit_movrr((ASMState *)&local_508[0].field_0,pIVar34,(uint)(pIVar34->field_1).r,uVar41);
      } while (local_480 <= local_488);
      goto LAB_0014869c;
    }
    bVar15 = *(byte *)((long)local_478 + 0x40006);
    if (-1 < (char)bVar15) {
      local_460 = CONCAT44(local_460._4_4_,(uint)local_460 | 1 << (bVar15 & 0x1f));
      if (((local_460._4_4_ >> (bVar15 & 0x1f) & 1) != 0) ||
         ((*(byte *)((long)local_478 + 0x40004) & 0x20) != 0)) {
        *(undefined1 *)((long)local_478 + 0x40006) = 0xff;
      }
      if (bVar15 != 2) {
        *(byte *)((long)local_488 + -1) = bVar15 * '\b' | 0xc2;
        *(byte *)((long)local_488 + -2) = 0x8b;
        if ((bVar15 & 8) == 0) {
          local_488 = (SnapEntry *)((long)local_488 + -2);
        }
        else {
          *(byte *)((long)local_488 + -3) = 0x44;
          local_488 = (SnapEntry *)((long)local_488 + -3);
        }
      }
    }
    pSVar42 = local_488;
    local_488[-1] = (uint)local_3f8->traceno;
    local_488[-2] = (int)local_470 - 0xe8;
    *(byte *)((long)local_488 + -9) = 0x25;
    ((byte *)((long)local_488 + -0xb))[0] = 199;
    ((byte *)((long)local_488 + -0xb))[1] = 4;
    local_488 = (SnapEntry *)((long)local_488 + -0xb);
    uVar55 = local_448 * 4 - 4 & 0xfffffff0;
    if ((int)local_448 < 5) {
      uVar55 = 0;
    }
    local_3f8->spadjust = (uint16_t)uVar55;
    if (uVar55 != 0) {
      if (uVar55 + 0x7f < 0x100) {
        *(byte *)(pSVar42 + -3) = (byte)-uVar55;
        pSVar42 = pSVar42 + -3;
        uVar28 = 0x830000fe;
      }
      else {
        *(uint *)((long)pSVar42 + -0xf) = -uVar55;
        pSVar42 = (SnapEntry *)((long)pSVar42 + -0xf);
        uVar28 = 0x810000fe;
      }
      *(byte *)((long)pSVar42 + -1) = 0xc4;
      *(undefined4 *)((long)pSVar42 + -5) = uVar28;
      *(byte *)((long)pSVar42 + -3) = 0x48;
      local_488 = (SnapEntry *)((long)pSVar42 + -3);
    }
    local_3f8->topslot = *(uint8_t *)((ulong)(local_3f8->startpt).gcptr32 + 7);
LAB_001485ab:
    J = local_160;
    pGVar21 = local_158;
    for (uVar55 = uStack_458._4_4_; unaff_RBP = (IRIns *)(ulong)uVar55, local_160 = J,
        local_158 = pGVar21, uVar55 != 0;
        uVar55 = uVar55 & (-2 << bVar46 | 0xfffffffeU >> 0x20 - bVar46)) {
      uVar57 = uVar55 >> 0x18 | (uVar55 & 0xff0000) >> 8 | (uVar55 & 0xff00) << 8 | uVar55 << 0x18;
      uVar41 = 0x1f;
      if (uVar57 != 0) {
        for (; uVar57 >> uVar41 == 0; uVar41 = uVar41 - 1) {
        }
      }
      uVar7 = *(ushort *)((long)&local_3b0 + (ulong)(uVar41 ^ 0x18) * 2);
      uVar39 = (ulong)uVar7;
      bVar15 = *(byte *)((long)local_478 + uVar39 * 8 + 4);
      bVar46 = (byte)(uVar41 ^ 0x18);
      if (((bVar15 & 0x20) != 0) &&
         (*(byte *)((long)local_478 + uVar39 * 8 + 4) = bVar15 & 0xdf,
         *(char *)((long)local_478 + uVar39 * 8 + 7) != '\0')) {
        (local_470->fold).ins.field_0.ot = 0x1400;
        (local_470->fold).ins.field_0.op1 = uVar7;
        (local_470->fold).ins.field_0.op2 = (IRRef1)local_428;
        pcStack_540 = (code *)0x148617;
        TVar19 = lj_ir_emit(local_470);
        uVar39 = (ulong)((TVar19 & 0xffff) << 3);
        *(byte *)((long)(local_470->cur).ir + uVar39 + 6) = bVar46;
        *(undefined1 *)((long)(local_470->cur).ir + uVar39 + 7) = 0;
      }
      bVar46 = bVar46 & 0x1f;
      J = local_160;
      pGVar21 = local_158;
    }
    T_00 = J->curfinal;
    if (pGVar21->nins <= T_00->nins) {
      pcStack_540 = (code *)0x1486ce;
      memcpy(T_00->ir + local_438,pGVar21->ir + local_438,(ulong)(pGVar21->nins - local_438) << 3);
      pGVar21->nins = J->curfinal->nins;
      local_440 = 0x8001;
      pcStack_540 = (code *)0x1486eb;
      asm_snap_prev((ASMState *)&local_508[0].field_0);
      if ((uint)local_460 == -0x11) {
        pGVar21->mcode = (MCode *)local_488;
        MVar20 = 0;
        if (local_3d0 != (SnapEntry *)0x0) {
          MVar20 = (int)local_3d0 - (int)local_488;
        }
        pGVar21->mcloop = MVar20;
        pSVar42 = local_3e0;
        if (local_404 == 0) {
          uVar7 = pGVar21->link;
          uVar9 = local_3f8->spadjust;
          if (uVar9 == 0) {
            pSVar42 = (SnapEntry *)((long)local_3e0 + -7);
          }
          else {
            if ((uint)uVar9 == (int)(char)(byte)uVar9) {
              *(byte *)((long)local_3e0 + -9) = (byte)uVar9;
              bVar15 = 0x83;
              pSVar42 = (SnapEntry *)((long)local_3e0 + -3);
            }
            else {
              *(uint *)((long)local_3e0 + -9) = (uint)uVar9;
              bVar15 = 0x81;
            }
            *(byte *)(local_3e0 + -3) = 0x48;
            *(byte *)((long)local_3e0 + -0xb) = bVar15;
            *(byte *)((long)local_3e0 + -10) = 0xc4;
          }
          if ((ulong)uVar7 == 0) {
            iVar27 = 0x142356;
          }
          else {
            iVar27 = (int)*(undefined8 *)((ulong)local_470->trace[uVar7].gcptr32 + 0x40);
          }
          pSVar42[-1] = iVar27 - (int)pSVar42;
          *(byte *)((long)pSVar42 + -5) = 0xe9;
          if (pSVar42 <= (SnapEntry *)((long)local_3e0 - 1U)) {
            pbVar32 = (byte *)((long)local_3e0 - 2U);
            if ((byte *)((long)pSVar42 - 1U) < (byte *)((long)local_3e0 - 2U)) {
              pbVar32 = (byte *)((long)pSVar42 - 1U);
            }
            pcStack_540 = (code *)0x1487d6;
            memset(pbVar32 + 1,0x90,(size_t)(~(ulong)pbVar32 + (long)local_3e0));
          }
        }
        local_3e0 = pSVar42;
        pGVar21->szmcode = (int)local_3e0 - (int)local_488;
        pSVar10 = local_3f8->snap;
        uVar55 = local_3f8->nsnap - 1;
        if (uVar55 != 0) {
          uVar39 = (ulong)uVar55;
          puVar49 = &pSVar10[uVar39].mcofs;
          do {
            uVar39 = uVar39 - 1;
            *puVar49 = ((short)local_3d8 - (short)local_488) - pSVar10[uVar39 & 0xffffffff].mcofs;
            puVar49 = puVar49 + -6;
          } while ((int)uVar39 != 0);
        }
        pSVar10->mcofs = 0;
        pcStack_540 = (code *)0x148857;
        lj_mcode_sync(pGVar21->mcode,local_3d8);
        return;
      }
      pcStack_540 = asm_snap_prev;
      lj_trace_err(local_470,LJ_TRERR_BADRA);
    }
    pcStack_540 = (code *)0x148679;
    lj_trace_free(local_140,T_00);
    J->curfinal = (GCtrace *)0x0;
    pcStack_540 = (code *)0x14868b;
    pGVar21 = lj_trace_alloc(J->L,pGVar21);
    J->curfinal = pGVar21;
    local_3b8 = (SnapEntry *)0x0;
  }
  goto LAB_00143ce3;
}

Assistant:

void lj_asm_trace(jit_State *J, GCtrace *T)
{
  ASMState as_;
  ASMState *as = &as_;

  /* Remove nops/renames left over from ASM restart due to LJ_TRERR_MCODELM. */
  {
    IRRef nins = T->nins;
    IRIns *ir = &T->ir[nins-1];
    if (ir->o == IR_NOP || ir->o == IR_RENAME) {
      do { ir--; nins--; } while (ir->o == IR_NOP || ir->o == IR_RENAME);
      T->nins = nins;
    }
  }

  /* Ensure an initialized instruction beyond the last one for HIOP checks. */
  /* This also allows one RENAME to be added without reallocating curfinal. */
  as->orignins = lj_ir_nextins(J);
  lj_ir_nop(&J->cur.ir[as->orignins]);

  /* Setup initial state. Copy some fields to reduce indirections. */
  as->J = J;
  as->T = T;
  J->curfinal = lj_trace_alloc(J->L, T);  /* This copies the IR, too. */
  as->flags = J->flags;
  as->loopref = J->loopref;
  as->realign = NULL;
  as->loopinv = 0;
  as->parent = J->parent ? traceref(J, J->parent) : NULL;

  /* Reserve MCode memory. */
  as->mctop = as->mctoporig = lj_mcode_reserve(J, &as->mcbot);
  as->mcp = as->mctop;
  as->mclim = as->mcbot + MCLIM_REDZONE;
  asm_setup_target(as);

  /*
  ** This is a loop, because the MCode may have to be (re-)assembled
  ** multiple times:
  **
  ** 1. as->realign is set (and the assembly aborted), if the arch-specific
  **    backend wants the MCode to be aligned differently.
  **
  **    This is currently only the case on x86/x64, where small loops get
  **    an aligned loop body plus a short branch. Not much effort is wasted,
  **    because the abort happens very quickly and only once.
  **
  ** 2. The IR is immovable, since the MCode embeds pointers to various
  **    constants inside the IR. But RENAMEs may need to be added to the IR
  **    during assembly, which might grow and reallocate the IR. We check
  **    at the end if the IR (in J->cur.ir) has actually grown, resize the
  **    copy (in J->curfinal.ir) and try again.
  **
  **    95% of all traces have zero RENAMEs, 3% have one RENAME, 1.5% have
  **    2 RENAMEs and only 0.5% have more than that. That's why we opt to
  **    always have one spare slot in the IR (see above), which means we
  **    have to redo the assembly for only ~2% of all traces.
  **
  **    Very, very rarely, this needs to be done repeatedly, since the
  **    location of constants inside the IR (actually, reachability from
  **    a global pointer) may affect register allocation and thus the
  **    number of RENAMEs.
  */
  for (;;) {
    as->mcp = as->mctop;
#ifdef LUA_USE_ASSERT
    as->mcp_prev = as->mcp;
#endif
    as->ir = J->curfinal->ir;  /* Use the copied IR. */
    as->curins = J->cur.nins = as->orignins;

    RA_DBG_START();
    RA_DBGX((as, "===== STOP ====="));

    /* General trace setup. Emit tail of trace. */
    asm_tail_prep(as);
    as->mcloop = NULL;
    as->flagmcp = NULL;
    as->topslot = 0;
    as->gcsteps = 0;
    as->sectref = as->loopref;
    as->fuseref = (as->flags & JIT_F_OPT_FUSE) ? as->loopref : FUSE_DISABLED;
    asm_setup_regsp(as);
    if (!as->loopref)
      asm_tail_link(as);

    /* Assemble a trace in linear backwards order. */
    for (as->curins--; as->curins > as->stopins; as->curins--) {
      IRIns *ir = IR(as->curins);
      /* 64 bit types handled by SPLIT for 32 bit archs. */
      lj_assertA(!(LJ_32 && irt_isint64(ir->t)),
		 "IR %04d has unsplit 64 bit type",
		 (int)(ir - as->ir) - REF_BIAS);
      asm_snap_prev(as);
      if (!ra_used(ir) && !ir_sideeff(ir) && (as->flags & JIT_F_OPT_DCE))
	continue;  /* Dead-code elimination can be soooo easy. */
      if (irt_isguard(ir->t))
	asm_snap_prep(as);
      RA_DBG_REF();
      checkmclim(as);
      asm_ir(as, ir);
    }

    if (as->realign && J->curfinal->nins >= T->nins)
      continue;  /* Retry in case only the MCode needs to be realigned. */

    /* Emit head of trace. */
    RA_DBG_REF();
    checkmclim(as);
    if (as->gcsteps > 0) {
      as->curins = as->T->snap[0].ref;
      asm_snap_prep(as);  /* The GC check is a guard. */
      asm_gc_check(as);
      as->curins = as->stopins;
    }
    ra_evictk(as);
    if (as->parent)
      asm_head_side(as);
    else
      asm_head_root(as);
    asm_phi_fixup(as);

    if (J->curfinal->nins >= T->nins) {  /* IR didn't grow? */
      lj_assertA(J->curfinal->nk == T->nk, "unexpected IR constant growth");
      memcpy(J->curfinal->ir + as->orignins, T->ir + as->orignins,
	     (T->nins - as->orignins) * sizeof(IRIns));  /* Copy RENAMEs. */
      T->nins = J->curfinal->nins;
      /* Fill mcofs of any unprocessed snapshots. */
      as->curins = REF_FIRST;
      asm_snap_prev(as);
      break;  /* Done. */
    }

    /* Otherwise try again with a bigger IR. */
    lj_trace_free(J2G(J), J->curfinal);
    J->curfinal = NULL;  /* In case lj_trace_alloc() OOMs. */
    J->curfinal = lj_trace_alloc(J->L, T);
    as->realign = NULL;
  }

  RA_DBGX((as, "===== START ===="));
  RA_DBG_FLUSH();
  if (as->freeset != RSET_ALL)
    lj_trace_err(as->J, LJ_TRERR_BADRA);  /* Ouch! Should never happen. */

  /* Set trace entry point before fixing up tail to allow link to self. */
  T->mcode = as->mcp;
  T->mcloop = as->mcloop ? (MSize)((char *)as->mcloop - (char *)as->mcp) : 0;
  if (!as->loopref)
    asm_tail_fixup(as, T->link);  /* Note: this may change as->mctop! */
  T->szmcode = (MSize)((char *)as->mctop - (char *)as->mcp);
  asm_snap_fixup_mcofs(as);
#if LJ_TARGET_MCODE_FIXUP
  asm_mcode_fixup(T->mcode, T->szmcode);
#endif
  lj_mcode_sync(T->mcode, as->mctoporig);
}